

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx2::CurveNiIntersectorK<4,8>::
     intersect_hn<embree::avx2::OrientedCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  Primitive PVar2;
  uint uVar3;
  Geometry *pGVar4;
  long lVar5;
  __int_type_conflict _Var6;
  RTCFilterFunctionN p_Var7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  int iVar46;
  uint uVar47;
  uint uVar48;
  ulong uVar49;
  ulong uVar50;
  long lVar52;
  byte bVar53;
  uint uVar54;
  ulong uVar55;
  uint uVar56;
  undefined4 uVar57;
  undefined8 in_R11;
  float fVar58;
  float fVar59;
  float fVar84;
  float fVar86;
  vint4 bi_2;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar85;
  float fVar87;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined8 uVar88;
  vint4 bi_1;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar116;
  vint4 ai_2;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar129;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar130;
  float fVar140;
  vint4 ai;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  vint4 bi;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  float fVar154;
  float fVar155;
  float fVar172;
  float fVar173;
  vint4 ai_1;
  undefined1 auVar156 [16];
  float fVar174;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  float fVar186;
  vfloat4 a0_3;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar179 [16];
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  float fVar187;
  undefined1 auVar185 [32];
  float fVar191;
  float fVar202;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  float fVar203;
  float fVar220;
  __m128 a;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar221;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [64];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  vfloat4 a0_1;
  undefined1 auVar241 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar240 [16];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  float fVar250;
  float fVar260;
  float fVar261;
  vfloat4 a0;
  undefined1 auVar251 [16];
  float fVar262;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [32];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar265 [16];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar277 [32];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_790 [8];
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [8];
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined1 local_740 [32];
  undefined1 local_700 [32];
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  uint local_5f8;
  RTCFilterFunctionNArguments local_5f0;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 local_590 [8];
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  uint local_510;
  uint uStack_50c;
  uint uStack_508;
  uint uStack_504;
  undefined1 local_500 [16];
  uint auStack_4f0 [4];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_490 [16];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  uint uStack_380;
  float afStack_37c [7];
  undefined1 local_360 [32];
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  ulong auStack_1a0 [4];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar51;
  undefined1 auVar276 [32];
  
  PVar2 = prim[1];
  uVar49 = (ulong)(byte)PVar2;
  fVar58 = *(float *)(prim + uVar49 * 0x19 + 0x12);
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar8 = vsubps_avx(auVar8,*(undefined1 (*) [16])(prim + uVar49 * 0x19 + 6));
  auVar60._0_4_ = fVar58 * auVar8._0_4_;
  auVar60._4_4_ = fVar58 * auVar8._4_4_;
  auVar60._8_4_ = fVar58 * auVar8._8_4_;
  auVar60._12_4_ = fVar58 * auVar8._12_4_;
  auVar141._0_4_ = fVar58 * auVar9._0_4_;
  auVar141._4_4_ = fVar58 * auVar9._4_4_;
  auVar141._8_4_ = fVar58 * auVar9._8_4_;
  auVar141._12_4_ = fVar58 * auVar9._12_4_;
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 4 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 5 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar122 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 6 + 6)));
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0xb + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0xc + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0xd + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar63 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0x12 + 6)));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar62 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0x13 + 6)));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0x14 + 6)));
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar263._4_4_ = auVar141._0_4_;
  auVar263._0_4_ = auVar141._0_4_;
  auVar263._8_4_ = auVar141._0_4_;
  auVar263._12_4_ = auVar141._0_4_;
  auVar89 = vshufps_avx(auVar141,auVar141,0x55);
  auVar61 = vshufps_avx(auVar141,auVar141,0xaa);
  fVar58 = auVar61._0_4_;
  auVar222._0_4_ = fVar58 * auVar122._0_4_;
  fVar84 = auVar61._4_4_;
  auVar222._4_4_ = fVar84 * auVar122._4_4_;
  fVar86 = auVar61._8_4_;
  auVar222._8_4_ = fVar86 * auVar122._8_4_;
  fVar116 = auVar61._12_4_;
  auVar222._12_4_ = fVar116 * auVar122._12_4_;
  auVar204._0_4_ = auVar13._0_4_ * fVar58;
  auVar204._4_4_ = auVar13._4_4_ * fVar84;
  auVar204._8_4_ = auVar13._8_4_ * fVar86;
  auVar204._12_4_ = auVar13._12_4_ * fVar116;
  auVar175._0_4_ = auVar107._0_4_ * fVar58;
  auVar175._4_4_ = auVar107._4_4_ * fVar84;
  auVar175._8_4_ = auVar107._8_4_ * fVar86;
  auVar175._12_4_ = auVar107._12_4_ * fVar116;
  auVar61 = vfmadd231ps_fma(auVar222,auVar89,auVar9);
  auVar241 = vfmadd231ps_fma(auVar204,auVar89,auVar12);
  auVar89 = vfmadd231ps_fma(auVar175,auVar62,auVar89);
  auVar117 = vfmadd231ps_fma(auVar61,auVar263,auVar8);
  auVar241 = vfmadd231ps_fma(auVar241,auVar263,auVar11);
  auVar132 = vfmadd231ps_fma(auVar89,auVar63,auVar263);
  auVar264._4_4_ = auVar60._0_4_;
  auVar264._0_4_ = auVar60._0_4_;
  auVar264._8_4_ = auVar60._0_4_;
  auVar264._12_4_ = auVar60._0_4_;
  auVar89 = vshufps_avx(auVar60,auVar60,0x55);
  auVar61 = vshufps_avx(auVar60,auVar60,0xaa);
  fVar58 = auVar61._0_4_;
  auVar119._0_4_ = fVar58 * auVar122._0_4_;
  fVar84 = auVar61._4_4_;
  auVar119._4_4_ = fVar84 * auVar122._4_4_;
  fVar86 = auVar61._8_4_;
  auVar119._8_4_ = fVar86 * auVar122._8_4_;
  fVar116 = auVar61._12_4_;
  auVar119._12_4_ = fVar116 * auVar122._12_4_;
  auVar235._0_4_ = auVar13._0_4_ * fVar58;
  auVar235._4_4_ = auVar13._4_4_ * fVar84;
  auVar235._8_4_ = auVar13._8_4_ * fVar86;
  auVar235._12_4_ = auVar13._12_4_ * fVar116;
  auVar61._0_4_ = auVar107._0_4_ * fVar58;
  auVar61._4_4_ = auVar107._4_4_ * fVar84;
  auVar61._8_4_ = auVar107._8_4_ * fVar86;
  auVar61._12_4_ = auVar107._12_4_ * fVar116;
  auVar9 = vfmadd231ps_fma(auVar119,auVar89,auVar9);
  auVar122 = vfmadd231ps_fma(auVar235,auVar89,auVar12);
  auVar12 = vfmadd231ps_fma(auVar61,auVar89,auVar62);
  auVar13 = vfmadd231ps_fma(auVar9,auVar264,auVar8);
  auVar62 = vfmadd231ps_fma(auVar122,auVar264,auVar11);
  local_500._8_4_ = 0x7fffffff;
  local_500._0_8_ = 0x7fffffff7fffffff;
  local_500._12_4_ = 0x7fffffff;
  auVar107 = vfmadd231ps_fma(auVar12,auVar264,auVar63);
  auVar8 = vandps_avx(auVar117,local_500);
  auVar131._8_4_ = 0x219392ef;
  auVar131._0_8_ = 0x219392ef219392ef;
  auVar131._12_4_ = 0x219392ef;
  auVar8 = vcmpps_avx(auVar8,auVar131,1);
  auVar9 = vblendvps_avx(auVar117,auVar131,auVar8);
  auVar8 = vandps_avx(auVar241,local_500);
  auVar8 = vcmpps_avx(auVar8,auVar131,1);
  auVar122 = vblendvps_avx(auVar241,auVar131,auVar8);
  auVar8 = vandps_avx(local_500,auVar132);
  auVar8 = vcmpps_avx(auVar8,auVar131,1);
  auVar8 = vblendvps_avx(auVar132,auVar131,auVar8);
  auVar11 = vrcpps_avx(auVar9);
  auVar176._8_4_ = 0x3f800000;
  auVar176._0_8_ = 0x3f8000003f800000;
  auVar176._12_4_ = 0x3f800000;
  auVar9 = vfnmadd213ps_fma(auVar9,auVar11,auVar176);
  auVar11 = vfmadd132ps_fma(auVar9,auVar11,auVar11);
  auVar9 = vrcpps_avx(auVar122);
  auVar122 = vfnmadd213ps_fma(auVar122,auVar9,auVar176);
  auVar12 = vfmadd132ps_fma(auVar122,auVar9,auVar9);
  auVar9 = vrcpps_avx(auVar8);
  auVar8 = vfnmadd213ps_fma(auVar8,auVar9,auVar176);
  auVar63 = vfmadd132ps_fma(auVar8,auVar9,auVar9);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar49 * 7 + 6);
  auVar8 = vpmovsxwd_avx(auVar8);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar122 = vsubps_avx(auVar8,auVar13);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar49 * 9 + 6);
  auVar8 = vpmovsxwd_avx(auVar9);
  auVar132._0_4_ = auVar11._0_4_ * auVar122._0_4_;
  auVar132._4_4_ = auVar11._4_4_ * auVar122._4_4_;
  auVar132._8_4_ = auVar11._8_4_ * auVar122._8_4_;
  auVar132._12_4_ = auVar11._12_4_ * auVar122._12_4_;
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar13);
  auVar142._0_4_ = auVar11._0_4_ * auVar8._0_4_;
  auVar142._4_4_ = auVar11._4_4_ * auVar8._4_4_;
  auVar142._8_4_ = auVar11._8_4_ * auVar8._8_4_;
  auVar142._12_4_ = auVar11._12_4_ * auVar8._12_4_;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = *(ulong *)(prim + uVar49 * 0xe + 6);
  auVar8 = vpmovsxwd_avx(auVar122);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vsubps_avx(auVar8,auVar62);
  auVar241._1_3_ = 0;
  auVar241[0] = PVar2;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar8 = vpmovsxwd_avx(auVar11);
  auVar156._0_4_ = auVar12._0_4_ * auVar9._0_4_;
  auVar156._4_4_ = auVar12._4_4_ * auVar9._4_4_;
  auVar156._8_4_ = auVar12._8_4_ * auVar9._8_4_;
  auVar156._12_4_ = auVar12._12_4_ * auVar9._12_4_;
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar62);
  auVar89._0_4_ = auVar12._0_4_ * auVar8._0_4_;
  auVar89._4_4_ = auVar12._4_4_ * auVar8._4_4_;
  auVar89._8_4_ = auVar12._8_4_ * auVar8._8_4_;
  auVar89._12_4_ = auVar12._12_4_ * auVar8._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar49 * 0x15 + 6);
  auVar8 = vpmovsxwd_avx(auVar12);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar107);
  auVar117._0_4_ = auVar63._0_4_ * auVar8._0_4_;
  auVar117._4_4_ = auVar63._4_4_ * auVar8._4_4_;
  auVar117._8_4_ = auVar63._8_4_ * auVar8._8_4_;
  auVar117._12_4_ = auVar63._12_4_ * auVar8._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar49 * 0x17 + 6);
  auVar8 = vpmovsxwd_avx(auVar13);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar107);
  auVar62._0_4_ = auVar63._0_4_ * auVar8._0_4_;
  auVar62._4_4_ = auVar63._4_4_ * auVar8._4_4_;
  auVar62._8_4_ = auVar63._8_4_ * auVar8._8_4_;
  auVar62._12_4_ = auVar63._12_4_ * auVar8._12_4_;
  auVar8 = vpminsd_avx(auVar132,auVar142);
  auVar9 = vpminsd_avx(auVar156,auVar89);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  auVar9 = vpminsd_avx(auVar117,auVar62);
  uVar57 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar205._4_4_ = uVar57;
  auVar205._0_4_ = uVar57;
  auVar205._8_4_ = uVar57;
  auVar205._12_4_ = uVar57;
  auVar9 = vmaxps_avx(auVar9,auVar205);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  local_490._0_4_ = auVar8._0_4_ * 0.99999964;
  local_490._4_4_ = auVar8._4_4_ * 0.99999964;
  local_490._8_4_ = auVar8._8_4_ * 0.99999964;
  local_490._12_4_ = auVar8._12_4_ * 0.99999964;
  auVar8 = vpmaxsd_avx(auVar132,auVar142);
  auVar9 = vpmaxsd_avx(auVar156,auVar89);
  auVar8 = vminps_avx(auVar8,auVar9);
  auVar9 = vpmaxsd_avx(auVar117,auVar62);
  uVar57 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar107._4_4_ = uVar57;
  auVar107._0_4_ = uVar57;
  auVar107._8_4_ = uVar57;
  auVar107._12_4_ = uVar57;
  auVar9 = vminps_avx(auVar9,auVar107);
  auVar8 = vminps_avx(auVar8,auVar9);
  auVar63._0_4_ = auVar8._0_4_ * 1.0000004;
  auVar63._4_4_ = auVar8._4_4_ * 1.0000004;
  auVar63._8_4_ = auVar8._8_4_ * 1.0000004;
  auVar63._12_4_ = auVar8._12_4_ * 1.0000004;
  auVar241[4] = PVar2;
  auVar241._5_3_ = 0;
  auVar241[8] = PVar2;
  auVar241._9_3_ = 0;
  auVar241[0xc] = PVar2;
  auVar241._13_3_ = 0;
  auVar9 = vpcmpgtd_avx(auVar241,_DAT_01f4ad30);
  auVar8 = vcmpps_avx(local_490,auVar63,2);
  auVar8 = vandps_avx(auVar8,auVar9);
  uVar57 = vmovmskps_avx(auVar8);
  uVar49 = CONCAT44((int)((ulong)in_R11 >> 0x20),uVar57);
  auVar79._16_16_ = mm_lookupmask_ps._240_16_;
  auVar79._0_16_ = mm_lookupmask_ps._240_16_;
  local_300 = vblendps_avx(auVar79,ZEXT832(0) << 0x20,0x80);
  iVar46 = 1 << ((uint)k & 0x1f);
  auVar80._4_4_ = iVar46;
  auVar80._0_4_ = iVar46;
  auVar80._8_4_ = iVar46;
  auVar80._12_4_ = iVar46;
  auVar80._16_4_ = iVar46;
  auVar80._20_4_ = iVar46;
  auVar80._24_4_ = iVar46;
  auVar80._28_4_ = iVar46;
  auVar15 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar79 = vpand_avx2(auVar80,auVar15);
  local_360 = vpcmpeqd_avx2(auVar79,auVar15);
LAB_0115e8c8:
  if (uVar49 == 0) {
    return;
  }
  lVar52 = 0;
  for (uVar50 = uVar49; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000) {
    lVar52 = lVar52 + 1;
  }
  uVar48 = *(uint *)(prim + 2);
  uVar3 = *(uint *)(prim + lVar52 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar48].ptr;
  lVar5 = *(long *)&pGVar4[1].time_range.upper;
  uVar50 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           (ulong)uVar3 *
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar8 = *(undefined1 (*) [16])(lVar5 + (long)pGVar4[1].intersectionFilterN * uVar50);
  lVar52 = uVar50 + 1;
  auVar9 = *(undefined1 (*) [16])(lVar5 + (long)pGVar4[1].intersectionFilterN * lVar52);
  _Var6 = pGVar4[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar122 = *(undefined1 (*) [16])(_Var6 + (long)pGVar4[2].userPtr * uVar50);
  auVar11 = *(undefined1 (*) [16])(_Var6 + (long)pGVar4[2].userPtr * lVar52);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar271._8_4_ = 0x3eaaaaab;
  auVar271._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar271._12_4_ = 0x3eaaaaab;
  auVar13 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar4[2].intersectionFilterN +
                             (long)pGVar4[2].pointQueryFunc * uVar50),auVar8,auVar271);
  auVar89 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar4[2].intersectionFilterN +
                              (long)pGVar4[2].pointQueryFunc * lVar52),auVar9,auVar271);
  auVar63 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             ((long)pGVar4[3].userPtr +
                             uVar50 * *(long *)&pGVar4[3].fnumTimeSegments),auVar122,auVar271);
  auVar61 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              ((long)pGVar4[3].userPtr +
                              *(long *)&pGVar4[3].fnumTimeSegments * lVar52),auVar11,auVar271);
  auVar64._12_4_ = 0;
  auVar64._0_12_ = ZEXT812(0);
  auVar64 = auVar64 << 0x20;
  auVar90._0_4_ = auVar9._0_4_ * 0.0;
  auVar90._4_4_ = auVar9._4_4_ * 0.0;
  auVar90._8_4_ = auVar9._8_4_ * 0.0;
  auVar90._12_4_ = auVar9._12_4_ * 0.0;
  auVar107 = vfmadd231ps_fma(auVar90,auVar89,auVar64);
  auVar62 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar13,auVar107);
  local_790._0_4_ = auVar8._0_4_ + auVar62._0_4_;
  local_790._4_4_ = auVar8._4_4_ + auVar62._4_4_;
  fStack_788 = auVar8._8_4_ + auVar62._8_4_;
  fStack_784 = auVar8._12_4_ + auVar62._12_4_;
  auVar265._8_4_ = 0x40400000;
  auVar265._0_8_ = 0x4040000040400000;
  auVar265._12_4_ = 0x40400000;
  auVar62 = vfmadd231ps_fma(auVar107,auVar13,auVar265);
  auVar241 = vfnmadd231ps_fma(auVar62,auVar8,auVar265);
  auVar234._0_4_ = auVar11._0_4_ * 0.0;
  auVar234._4_4_ = auVar11._4_4_ * 0.0;
  auVar234._8_4_ = auVar11._8_4_ * 0.0;
  auVar234._12_4_ = auVar11._12_4_ * 0.0;
  auVar107 = vfmadd231ps_fma(auVar234,auVar61,auVar64);
  auVar62 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar63,auVar107);
  auVar251._0_4_ = auVar122._0_4_ + auVar62._0_4_;
  auVar251._4_4_ = auVar122._4_4_ + auVar62._4_4_;
  auVar251._8_4_ = auVar122._8_4_ + auVar62._8_4_;
  auVar251._12_4_ = auVar122._12_4_ + auVar62._12_4_;
  auVar62 = vfmadd231ps_fma(auVar107,auVar63,auVar265);
  auVar107 = vfnmadd231ps_fma(auVar62,auVar122,auVar265);
  auVar62 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar89,auVar9);
  auVar62 = vfmadd231ps_fma(auVar62,auVar13,auVar64);
  auVar62 = vfmadd231ps_fma(auVar62,auVar8,auVar64);
  auVar133._0_4_ = auVar9._0_4_ * 3.0;
  auVar133._4_4_ = auVar9._4_4_ * 3.0;
  auVar133._8_4_ = auVar9._8_4_ * 3.0;
  auVar133._12_4_ = auVar9._12_4_ * 3.0;
  auVar9 = vfnmadd231ps_fma(auVar133,auVar265,auVar89);
  auVar9 = vfmadd231ps_fma(auVar9,auVar64,auVar13);
  auVar89 = vfnmadd231ps_fma(auVar9,auVar64,auVar8);
  auVar8 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar61,auVar11);
  auVar8 = vfmadd231ps_fma(auVar8,auVar63,auVar64);
  auVar13 = vfmadd231ps_fma(auVar8,auVar122,auVar64);
  auVar177._0_4_ = auVar11._0_4_ * 3.0;
  auVar177._4_4_ = auVar11._4_4_ * 3.0;
  auVar177._8_4_ = auVar11._8_4_ * 3.0;
  auVar177._12_4_ = auVar11._12_4_ * 3.0;
  auVar8 = vfnmadd231ps_fma(auVar177,auVar265,auVar61);
  auVar8 = vfmadd231ps_fma(auVar8,auVar64,auVar63);
  auVar63 = vfnmadd231ps_fma(auVar8,auVar64,auVar122);
  auVar8 = vshufps_avx(auVar241,auVar241,0xc9);
  auVar9 = vshufps_avx(auVar251,auVar251,0xc9);
  fVar58 = auVar241._0_4_;
  auVar192._0_4_ = auVar9._0_4_ * fVar58;
  fVar86 = auVar241._4_4_;
  auVar192._4_4_ = auVar9._4_4_ * fVar86;
  fVar85 = auVar241._8_4_;
  auVar192._8_4_ = auVar9._8_4_ * fVar85;
  fVar59 = auVar241._12_4_;
  auVar192._12_4_ = auVar9._12_4_ * fVar59;
  auVar9 = vfmsub231ps_fma(auVar192,auVar8,auVar251);
  auVar122 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar107,auVar107,0xc9);
  auVar206._0_4_ = auVar9._0_4_ * fVar58;
  auVar206._4_4_ = auVar9._4_4_ * fVar86;
  auVar206._8_4_ = auVar9._8_4_ * fVar85;
  auVar206._12_4_ = auVar9._12_4_ * fVar59;
  auVar8 = vfmsub231ps_fma(auVar206,auVar8,auVar107);
  auVar11 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar9 = vshufps_avx(auVar89,auVar89,0xc9);
  auVar8 = vshufps_avx(auVar13,auVar13,0xc9);
  fVar84 = auVar89._0_4_;
  auVar223._0_4_ = auVar8._0_4_ * fVar84;
  fVar116 = auVar89._4_4_;
  auVar223._4_4_ = auVar8._4_4_ * fVar116;
  fVar87 = auVar89._8_4_;
  auVar223._8_4_ = auVar8._8_4_ * fVar87;
  fVar155 = auVar89._12_4_;
  auVar223._12_4_ = auVar8._12_4_ * fVar155;
  auVar8 = vfmsub231ps_fma(auVar223,auVar9,auVar13);
  auVar13 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vshufps_avx(auVar63,auVar63,0xc9);
  auVar224._0_4_ = auVar8._0_4_ * fVar84;
  auVar224._4_4_ = auVar8._4_4_ * fVar116;
  auVar224._8_4_ = auVar8._8_4_ * fVar87;
  auVar224._12_4_ = auVar8._12_4_ * fVar155;
  auVar8 = vdpps_avx(auVar122,auVar122,0x7f);
  auVar9 = vfmsub231ps_fma(auVar224,auVar9,auVar63);
  auVar63 = vshufps_avx(auVar9,auVar9,0xc9);
  fVar129 = auVar8._0_4_;
  auVar107 = ZEXT416((uint)fVar129);
  auVar9 = vrsqrtss_avx(auVar107,auVar107);
  fVar221 = auVar9._0_4_;
  fVar130 = fVar221 * 1.5 - fVar129 * 0.5 * fVar221 * fVar221 * fVar221;
  fVar154 = auVar122._0_4_ * fVar130;
  fVar172 = auVar122._4_4_ * fVar130;
  fVar173 = auVar122._8_4_ * fVar130;
  fVar174 = auVar122._12_4_ * fVar130;
  auVar9 = vdpps_avx(auVar122,auVar11,0x7f);
  auVar207._0_4_ = fVar129 * auVar11._0_4_;
  auVar207._4_4_ = fVar129 * auVar11._4_4_;
  auVar207._8_4_ = fVar129 * auVar11._8_4_;
  auVar207._12_4_ = fVar129 * auVar11._12_4_;
  fVar221 = auVar9._0_4_;
  auVar193._0_4_ = fVar221 * auVar122._0_4_;
  auVar193._4_4_ = fVar221 * auVar122._4_4_;
  auVar193._8_4_ = fVar221 * auVar122._8_4_;
  auVar193._12_4_ = fVar221 * auVar122._12_4_;
  auVar122 = vsubps_avx(auVar207,auVar193);
  auVar9 = vrcpss_avx(auVar107,auVar107);
  auVar8 = vfnmadd213ss_fma(auVar8,auVar9,SUB6416(ZEXT464(0x40000000),0));
  fVar221 = auVar9._0_4_ * auVar8._0_4_;
  auVar8 = vdpps_avx(auVar13,auVar13,0x7f);
  fVar129 = auVar8._0_4_;
  auVar107 = ZEXT416((uint)fVar129);
  auVar9 = vrsqrtss_avx(auVar107,auVar107);
  fVar140 = auVar9._0_4_;
  fVar140 = fVar140 * 1.5 - fVar129 * 0.5 * fVar140 * fVar140 * fVar140;
  auVar9 = vdpps_avx(auVar13,auVar63,0x7f);
  fVar250 = fVar140 * auVar13._0_4_;
  fVar260 = fVar140 * auVar13._4_4_;
  fVar261 = fVar140 * auVar13._8_4_;
  fVar262 = fVar140 * auVar13._12_4_;
  auVar178._0_4_ = fVar129 * auVar63._0_4_;
  auVar178._4_4_ = fVar129 * auVar63._4_4_;
  auVar178._8_4_ = fVar129 * auVar63._8_4_;
  auVar178._12_4_ = fVar129 * auVar63._12_4_;
  fVar129 = auVar9._0_4_;
  auVar143._0_4_ = fVar129 * auVar13._0_4_;
  auVar143._4_4_ = fVar129 * auVar13._4_4_;
  auVar143._8_4_ = fVar129 * auVar13._8_4_;
  auVar143._12_4_ = fVar129 * auVar13._12_4_;
  auVar11 = vsubps_avx(auVar178,auVar143);
  auVar9 = vrcpss_avx(auVar107,auVar107);
  auVar8 = vfnmadd213ss_fma(auVar8,auVar9,ZEXT416(0x40000000));
  fVar129 = auVar8._0_4_ * auVar9._0_4_;
  auVar8 = vshufps_avx(_local_790,_local_790,0xff);
  auVar208._0_4_ = auVar8._0_4_ * fVar154;
  auVar208._4_4_ = auVar8._4_4_ * fVar172;
  auVar208._8_4_ = auVar8._8_4_ * fVar173;
  auVar208._12_4_ = auVar8._12_4_ * fVar174;
  local_540 = vsubps_avx(_local_790,auVar208);
  auVar9 = vshufps_avx(auVar241,auVar241,0xff);
  auVar157._0_4_ = auVar9._0_4_ * fVar154 + fVar130 * auVar122._0_4_ * fVar221 * auVar8._0_4_;
  auVar157._4_4_ = auVar9._4_4_ * fVar172 + fVar130 * auVar122._4_4_ * fVar221 * auVar8._4_4_;
  auVar157._8_4_ = auVar9._8_4_ * fVar173 + fVar130 * auVar122._8_4_ * fVar221 * auVar8._8_4_;
  auVar157._12_4_ = auVar9._12_4_ * fVar174 + fVar130 * auVar122._12_4_ * fVar221 * auVar8._12_4_;
  auVar122 = vsubps_avx(auVar241,auVar157);
  local_550._0_4_ = auVar208._0_4_ + (float)local_790._0_4_;
  local_550._4_4_ = auVar208._4_4_ + (float)local_790._4_4_;
  fStack_548 = auVar208._8_4_ + fStack_788;
  fStack_544 = auVar208._12_4_ + fStack_784;
  auVar8 = vshufps_avx(auVar62,auVar62,0xff);
  auVar108._0_4_ = fVar250 * auVar8._0_4_;
  auVar108._4_4_ = fVar260 * auVar8._4_4_;
  auVar108._8_4_ = fVar261 * auVar8._8_4_;
  auVar108._12_4_ = fVar262 * auVar8._12_4_;
  local_560 = vsubps_avx(auVar62,auVar108);
  auVar9 = vshufps_avx(auVar89,auVar89,0xff);
  auVar91._0_4_ = fVar250 * auVar9._0_4_ + auVar8._0_4_ * fVar140 * auVar11._0_4_ * fVar129;
  auVar91._4_4_ = fVar260 * auVar9._4_4_ + auVar8._4_4_ * fVar140 * auVar11._4_4_ * fVar129;
  auVar91._8_4_ = fVar261 * auVar9._8_4_ + auVar8._8_4_ * fVar140 * auVar11._8_4_ * fVar129;
  auVar91._12_4_ = fVar262 * auVar9._12_4_ + auVar8._12_4_ * fVar140 * auVar11._12_4_ * fVar129;
  auVar8 = vsubps_avx(auVar89,auVar91);
  fVar154 = auVar62._0_4_ + auVar108._0_4_;
  fVar172 = auVar62._4_4_ + auVar108._4_4_;
  fVar173 = auVar62._8_4_ + auVar108._8_4_;
  fVar174 = auVar62._12_4_ + auVar108._12_4_;
  local_570._0_4_ = local_540._0_4_ + auVar122._0_4_ * 0.33333334;
  local_570._4_4_ = local_540._4_4_ + auVar122._4_4_ * 0.33333334;
  local_570._8_4_ = local_540._8_4_ + auVar122._8_4_ * 0.33333334;
  local_570._12_4_ = local_540._12_4_ + auVar122._12_4_ * 0.33333334;
  auVar92._0_4_ = auVar8._0_4_ * 0.33333334;
  auVar92._4_4_ = auVar8._4_4_ * 0.33333334;
  auVar92._8_4_ = auVar8._8_4_ * 0.33333334;
  auVar92._12_4_ = auVar8._12_4_ * 0.33333334;
  local_580 = vsubps_avx(local_560,auVar92);
  local_520 = vsubps_avx(local_540,auVar12);
  auVar8 = vshufps_avx(local_520,local_520,0x55);
  auVar9 = vshufps_avx(local_520,local_520,0xaa);
  aVar1 = pre->ray_space[k].vy.field_0;
  fVar221 = pre->ray_space[k].vz.field_0.m128[0];
  fVar129 = pre->ray_space[k].vz.field_0.m128[1];
  fVar130 = pre->ray_space[k].vz.field_0.m128[2];
  fVar140 = pre->ray_space[k].vz.field_0.m128[3];
  auVar93._0_4_ = fVar221 * auVar9._0_4_;
  auVar93._4_4_ = fVar129 * auVar9._4_4_;
  auVar93._8_4_ = fVar130 * auVar9._8_4_;
  auVar93._12_4_ = fVar140 * auVar9._12_4_;
  auVar122 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar1,auVar8);
  local_530 = vsubps_avx(local_570,auVar12);
  auVar8 = vshufps_avx(local_530,local_530,0x55);
  auVar9 = vshufps_avx(local_530,local_530,0xaa);
  auVar272._0_4_ = fVar221 * auVar9._0_4_;
  auVar272._4_4_ = fVar129 * auVar9._4_4_;
  auVar272._8_4_ = fVar130 * auVar9._8_4_;
  auVar272._12_4_ = fVar140 * auVar9._12_4_;
  auVar9 = vfmadd231ps_fma(auVar272,(undefined1  [16])aVar1,auVar8);
  local_3e0 = vsubps_avx(local_580,auVar12);
  auVar8 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar239._0_4_ = fVar221 * auVar8._0_4_;
  auVar239._4_4_ = fVar129 * auVar8._4_4_;
  auVar239._8_4_ = fVar130 * auVar8._8_4_;
  auVar239._12_4_ = fVar140 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_3e0,local_3e0,0x55);
  auVar11 = vfmadd231ps_fma(auVar239,(undefined1  [16])aVar1,auVar8);
  local_3f0 = vsubps_avx(local_560,auVar12);
  auVar8 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar252._0_4_ = fVar221 * auVar8._0_4_;
  auVar252._4_4_ = fVar129 * auVar8._4_4_;
  auVar252._8_4_ = fVar130 * auVar8._8_4_;
  auVar252._12_4_ = fVar140 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_3f0,local_3f0,0x55);
  auVar13 = vfmadd231ps_fma(auVar252,(undefined1  [16])aVar1,auVar8);
  local_400 = vsubps_avx(_local_550,auVar12);
  auVar8 = vshufps_avx(local_400,local_400,0xaa);
  auVar144._0_4_ = fVar221 * auVar8._0_4_;
  auVar144._4_4_ = fVar129 * auVar8._4_4_;
  auVar144._8_4_ = fVar130 * auVar8._8_4_;
  auVar144._12_4_ = fVar140 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_400,local_400,0x55);
  auVar63 = vfmadd231ps_fma(auVar144,(undefined1  [16])aVar1,auVar8);
  local_590._0_4_ = (fVar58 + auVar157._0_4_) * 0.33333334 + (float)local_550._0_4_;
  local_590._4_4_ = (fVar86 + auVar157._4_4_) * 0.33333334 + (float)local_550._4_4_;
  fStack_588 = (fVar85 + auVar157._8_4_) * 0.33333334 + fStack_548;
  fStack_584 = (fVar59 + auVar157._12_4_) * 0.33333334 + fStack_544;
  local_410 = vsubps_avx(_local_590,auVar12);
  auVar8 = vshufps_avx(local_410,local_410,0xaa);
  auVar194._0_4_ = auVar8._0_4_ * fVar221;
  auVar194._4_4_ = auVar8._4_4_ * fVar129;
  auVar194._8_4_ = auVar8._8_4_ * fVar130;
  auVar194._12_4_ = auVar8._12_4_ * fVar140;
  auVar8 = vshufps_avx(local_410,local_410,0x55);
  auVar62 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar1,auVar8);
  auVar209._0_4_ = (fVar84 + auVar91._0_4_) * 0.33333334;
  auVar209._4_4_ = (fVar116 + auVar91._4_4_) * 0.33333334;
  auVar209._8_4_ = (fVar87 + auVar91._8_4_) * 0.33333334;
  auVar209._12_4_ = (fVar155 + auVar91._12_4_) * 0.33333334;
  auVar42._4_4_ = fVar172;
  auVar42._0_4_ = fVar154;
  auVar42._8_4_ = fVar173;
  auVar42._12_4_ = fVar174;
  _local_5a0 = vsubps_avx(auVar42,auVar209);
  local_420 = vsubps_avx(_local_5a0,auVar12);
  auVar8 = vshufps_avx(local_420,local_420,0xaa);
  auVar210._0_4_ = auVar8._0_4_ * fVar221;
  auVar210._4_4_ = auVar8._4_4_ * fVar129;
  auVar210._8_4_ = auVar8._8_4_ * fVar130;
  auVar210._12_4_ = auVar8._12_4_ * fVar140;
  auVar8 = vshufps_avx(local_420,local_420,0x55);
  auVar107 = vfmadd231ps_fma(auVar210,(undefined1  [16])aVar1,auVar8);
  local_430 = vsubps_avx(auVar42,auVar12);
  auVar8 = vshufps_avx(local_430,local_430,0xaa);
  auVar65._0_4_ = fVar221 * auVar8._0_4_;
  auVar65._4_4_ = fVar129 * auVar8._4_4_;
  auVar65._8_4_ = fVar130 * auVar8._8_4_;
  auVar65._12_4_ = fVar140 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_430,local_430,0x55);
  auVar8 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar1,auVar8);
  auVar158._4_4_ = local_520._0_4_;
  auVar158._0_4_ = local_520._0_4_;
  auVar158._8_4_ = local_520._0_4_;
  auVar158._12_4_ = local_520._0_4_;
  aVar1 = pre->ray_space[k].vx.field_0;
  auVar89 = vfmadd231ps_fma(auVar122,(undefined1  [16])aVar1,auVar158);
  auVar159._4_4_ = local_530._0_4_;
  auVar159._0_4_ = local_530._0_4_;
  auVar159._8_4_ = local_530._0_4_;
  auVar159._12_4_ = local_530._0_4_;
  auVar61 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar1,auVar159);
  uVar57 = local_3e0._0_4_;
  auVar160._4_4_ = uVar57;
  auVar160._0_4_ = uVar57;
  auVar160._8_4_ = uVar57;
  auVar160._12_4_ = uVar57;
  auVar241 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar1,auVar160);
  uVar57 = local_3f0._0_4_;
  auVar161._4_4_ = uVar57;
  auVar161._0_4_ = uVar57;
  auVar161._8_4_ = uVar57;
  auVar161._12_4_ = uVar57;
  auVar117 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar1,auVar161);
  uVar57 = local_400._0_4_;
  auVar162._4_4_ = uVar57;
  auVar162._0_4_ = uVar57;
  auVar162._8_4_ = uVar57;
  auVar162._12_4_ = uVar57;
  auVar63 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar1,auVar162);
  uVar57 = local_410._0_4_;
  auVar163._4_4_ = uVar57;
  auVar163._0_4_ = uVar57;
  auVar163._8_4_ = uVar57;
  auVar163._12_4_ = uVar57;
  auVar62 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar1,auVar163);
  uVar57 = local_420._0_4_;
  auVar164._4_4_ = uVar57;
  auVar164._0_4_ = uVar57;
  auVar164._8_4_ = uVar57;
  auVar164._12_4_ = uVar57;
  auVar107 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar1,auVar164);
  uVar57 = local_430._0_4_;
  auVar165._4_4_ = uVar57;
  auVar165._0_4_ = uVar57;
  auVar165._8_4_ = uVar57;
  auVar165._12_4_ = uVar57;
  auVar132 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar1,auVar165);
  auVar11 = vmovlhps_avx(auVar89,auVar63);
  auVar12 = vmovlhps_avx(auVar61,auVar62);
  auVar13 = vmovlhps_avx(auVar241,auVar107);
  _local_3c0 = vmovlhps_avx(auVar117,auVar132);
  auVar8 = vminps_avx(auVar11,auVar12);
  auVar9 = vminps_avx(auVar13,_local_3c0);
  auVar122 = vminps_avx(auVar8,auVar9);
  auVar8 = vmaxps_avx(auVar11,auVar12);
  auVar9 = vmaxps_avx(auVar13,_local_3c0);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  auVar9 = vshufpd_avx(auVar122,auVar122,3);
  auVar122 = vminps_avx(auVar122,auVar9);
  auVar9 = vshufpd_avx(auVar8,auVar8,3);
  auVar9 = vmaxps_avx(auVar8,auVar9);
  auVar8 = vandps_avx(local_500,auVar122);
  auVar9 = vandps_avx(local_500,auVar9);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  auVar9 = vmovshdup_avx(auVar8);
  auVar8 = vmaxss_avx(auVar9,auVar8);
  local_5f8 = (uint)uVar49 + 0xf;
  local_1c0 = auVar8._0_4_ * 9.536743e-07;
  auVar179._8_8_ = auVar89._0_8_;
  auVar179._0_8_ = auVar89._0_8_;
  auVar225._8_8_ = auVar61._0_8_;
  auVar225._0_8_ = auVar61._0_8_;
  auVar240._0_8_ = auVar241._0_8_;
  auVar240._8_8_ = auVar240._0_8_;
  auVar253._0_8_ = auVar117._0_8_;
  auVar253._8_8_ = auVar253._0_8_;
  local_3d0 = ZEXT416((uint)local_1c0);
  local_510 = 0x80000000;
  uStack_50c = 0x80000000;
  uStack_508 = 0x80000000;
  uStack_504 = 0x80000000;
  fStack_1bc = local_1c0;
  fStack_1b8 = local_1c0;
  fStack_1b4 = local_1c0;
  fStack_1b0 = local_1c0;
  fStack_1ac = local_1c0;
  fStack_1a8 = local_1c0;
  fStack_1a4 = local_1c0;
  fStack_1d8 = -local_1c0;
  local_1e0 = -local_1c0;
  fStack_1dc = -local_1c0;
  fStack_1d4 = fStack_1d8;
  fStack_1d0 = fStack_1d8;
  fStack_1cc = fStack_1d8;
  fStack_1c8 = fStack_1d8;
  fStack_1c4 = fStack_1d8;
  local_320 = uVar48;
  uStack_31c = uVar48;
  uStack_318 = uVar48;
  uStack_314 = uVar48;
  uStack_310 = uVar48;
  uStack_30c = uVar48;
  uStack_308 = uVar48;
  uStack_304 = uVar48;
  local_340 = uVar3;
  uStack_33c = uVar3;
  uStack_338 = uVar3;
  uStack_334 = uVar3;
  uStack_330 = uVar3;
  uStack_32c = uVar3;
  uStack_328 = uVar3;
  uStack_324 = uVar3;
  uVar50 = 0;
  fVar58 = *(float *)(ray + k * 4 + 0x60);
  local_390 = vsubps_avx(auVar12,auVar11);
  local_3a0 = vsubps_avx(auVar13,auVar12);
  local_3b0 = vsubps_avx(_local_3c0,auVar13);
  local_450 = vsubps_avx(_local_550,local_540);
  local_460 = vsubps_avx(_local_590,local_570);
  local_470 = vsubps_avx(_local_5a0,local_580);
  auVar43._4_4_ = fVar172;
  auVar43._0_4_ = fVar154;
  auVar43._8_4_ = fVar173;
  auVar43._12_4_ = fVar174;
  _local_480 = vsubps_avx(auVar43,local_560);
  auVar66 = ZEXT816(0x3f80000000000000);
  local_440 = auVar66;
LAB_0115f050:
  auVar8 = vshufps_avx(auVar66,auVar66,0x50);
  auVar273._8_4_ = 0x3f800000;
  auVar273._0_8_ = 0x3f8000003f800000;
  auVar273._12_4_ = 0x3f800000;
  auVar276._16_4_ = 0x3f800000;
  auVar276._0_16_ = auVar273;
  auVar276._20_4_ = 0x3f800000;
  auVar276._24_4_ = 0x3f800000;
  auVar276._28_4_ = 0x3f800000;
  auVar9 = vsubps_avx(auVar273,auVar8);
  fVar84 = auVar8._0_4_;
  fVar130 = auVar63._0_4_;
  auVar67._0_4_ = fVar130 * fVar84;
  fVar86 = auVar8._4_4_;
  fVar140 = auVar63._4_4_;
  auVar67._4_4_ = fVar140 * fVar86;
  fVar116 = auVar8._8_4_;
  auVar67._8_4_ = fVar130 * fVar116;
  fVar85 = auVar8._12_4_;
  auVar67._12_4_ = fVar140 * fVar85;
  fVar250 = auVar62._0_4_;
  auVar166._0_4_ = fVar250 * fVar84;
  fVar260 = auVar62._4_4_;
  auVar166._4_4_ = fVar260 * fVar86;
  auVar166._8_4_ = fVar250 * fVar116;
  auVar166._12_4_ = fVar260 * fVar85;
  fVar191 = auVar107._0_4_;
  auVar134._0_4_ = fVar191 * fVar84;
  fVar202 = auVar107._4_4_;
  auVar134._4_4_ = fVar202 * fVar86;
  auVar134._8_4_ = fVar191 * fVar116;
  auVar134._12_4_ = fVar202 * fVar85;
  fVar203 = auVar132._0_4_;
  auVar109._0_4_ = fVar203 * fVar84;
  fVar220 = auVar132._4_4_;
  auVar109._4_4_ = fVar220 * fVar86;
  auVar109._8_4_ = fVar203 * fVar116;
  auVar109._12_4_ = fVar220 * fVar85;
  auVar61 = vfmadd231ps_fma(auVar67,auVar9,auVar179);
  auVar241 = vfmadd231ps_fma(auVar166,auVar9,auVar225);
  auVar117 = vfmadd231ps_fma(auVar134,auVar9,auVar240);
  auVar60 = vfmadd231ps_fma(auVar109,auVar253,auVar9);
  auVar8 = vmovshdup_avx(local_440);
  fVar84 = local_440._0_4_;
  fStack_288 = (auVar8._0_4_ - fVar84) * 0.04761905;
  auVar218._4_4_ = fVar84;
  auVar218._0_4_ = fVar84;
  auVar218._8_4_ = fVar84;
  auVar218._12_4_ = fVar84;
  auVar218._16_4_ = fVar84;
  auVar218._20_4_ = fVar84;
  auVar218._24_4_ = fVar84;
  auVar218._28_4_ = fVar84;
  auVar103._0_8_ = auVar8._0_8_;
  auVar103._8_8_ = auVar103._0_8_;
  auVar103._16_8_ = auVar103._0_8_;
  auVar103._24_8_ = auVar103._0_8_;
  auVar79 = vsubps_avx(auVar103,auVar218);
  uVar57 = auVar61._0_4_;
  auVar269._4_4_ = uVar57;
  auVar269._0_4_ = uVar57;
  auVar269._8_4_ = uVar57;
  auVar269._12_4_ = uVar57;
  auVar269._16_4_ = uVar57;
  auVar269._20_4_ = uVar57;
  auVar269._24_4_ = uVar57;
  auVar269._28_4_ = uVar57;
  auVar8 = vmovshdup_avx(auVar61);
  uVar88 = auVar8._0_8_;
  auVar259._8_8_ = uVar88;
  auVar259._0_8_ = uVar88;
  auVar259._16_8_ = uVar88;
  auVar259._24_8_ = uVar88;
  fVar129 = auVar241._0_4_;
  auVar247._4_4_ = fVar129;
  auVar247._0_4_ = fVar129;
  auVar247._8_4_ = fVar129;
  auVar247._12_4_ = fVar129;
  auVar247._16_4_ = fVar129;
  auVar247._20_4_ = fVar129;
  auVar247._24_4_ = fVar129;
  auVar247._28_4_ = fVar129;
  auVar9 = vmovshdup_avx(auVar241);
  auVar104._0_8_ = auVar9._0_8_;
  auVar104._8_8_ = auVar104._0_8_;
  auVar104._16_8_ = auVar104._0_8_;
  auVar104._24_8_ = auVar104._0_8_;
  fVar221 = auVar117._0_4_;
  auVar183._4_4_ = fVar221;
  auVar183._0_4_ = fVar221;
  auVar183._8_4_ = fVar221;
  auVar183._12_4_ = fVar221;
  auVar183._16_4_ = fVar221;
  auVar183._20_4_ = fVar221;
  auVar183._24_4_ = fVar221;
  auVar183._28_4_ = fVar221;
  auVar122 = vmovshdup_avx(auVar117);
  auVar200._0_8_ = auVar122._0_8_;
  auVar200._8_8_ = auVar200._0_8_;
  auVar200._16_8_ = auVar200._0_8_;
  auVar200._24_8_ = auVar200._0_8_;
  fVar155 = auVar60._0_4_;
  auVar89 = vmovshdup_avx(auVar60);
  auVar235 = vfmadd132ps_fma(auVar79,auVar218,_DAT_01f7b040);
  auVar79 = vsubps_avx(auVar276,ZEXT1632(auVar235));
  fVar84 = auVar235._0_4_;
  fVar86 = auVar235._4_4_;
  auVar15._4_4_ = fVar129 * fVar86;
  auVar15._0_4_ = fVar129 * fVar84;
  fVar116 = auVar235._8_4_;
  auVar15._8_4_ = fVar129 * fVar116;
  fVar85 = auVar235._12_4_;
  auVar15._12_4_ = fVar129 * fVar85;
  auVar15._16_4_ = fVar129 * 0.0;
  auVar15._20_4_ = fVar129 * 0.0;
  auVar15._24_4_ = fVar129 * 0.0;
  auVar15._28_4_ = 0x3f800000;
  auVar235 = vfmadd231ps_fma(auVar15,auVar79,auVar269);
  fVar87 = auVar9._0_4_;
  fVar59 = auVar9._4_4_;
  auVar14._4_4_ = fVar59 * fVar86;
  auVar14._0_4_ = fVar87 * fVar84;
  auVar14._8_4_ = fVar87 * fVar116;
  auVar14._12_4_ = fVar59 * fVar85;
  auVar14._16_4_ = fVar87 * 0.0;
  auVar14._20_4_ = fVar59 * 0.0;
  auVar14._24_4_ = fVar87 * 0.0;
  auVar14._28_4_ = uVar57;
  auVar131 = vfmadd231ps_fma(auVar14,auVar79,auVar259);
  auVar10._4_4_ = fVar221 * fVar86;
  auVar10._0_4_ = fVar221 * fVar84;
  auVar10._8_4_ = fVar221 * fVar116;
  auVar10._12_4_ = fVar221 * fVar85;
  auVar10._16_4_ = fVar221 * 0.0;
  auVar10._20_4_ = fVar221 * 0.0;
  auVar10._24_4_ = fVar221 * 0.0;
  auVar10._28_4_ = auVar8._4_4_;
  auVar141 = vfmadd231ps_fma(auVar10,auVar79,auVar247);
  fVar87 = auVar122._0_4_;
  fVar59 = auVar122._4_4_;
  auVar16._4_4_ = fVar59 * fVar86;
  auVar16._0_4_ = fVar87 * fVar84;
  auVar16._8_4_ = fVar87 * fVar116;
  auVar16._12_4_ = fVar59 * fVar85;
  auVar16._16_4_ = fVar87 * 0.0;
  auVar16._20_4_ = fVar59 * 0.0;
  auVar16._24_4_ = fVar87 * 0.0;
  auVar16._28_4_ = fVar129;
  auVar119 = vfmadd231ps_fma(auVar16,auVar79,auVar104);
  auVar8 = vshufps_avx(auVar61,auVar61,0xaa);
  local_740._8_8_ = auVar8._0_8_;
  local_740._0_8_ = local_740._8_8_;
  local_740._16_8_ = local_740._8_8_;
  local_740._24_8_ = local_740._8_8_;
  auVar9 = vshufps_avx(auVar61,auVar61,0xff);
  uStack_778 = auVar9._0_8_;
  local_780 = (undefined1  [8])uStack_778;
  uStack_770 = uStack_778;
  uStack_768 = uStack_778;
  auVar17._4_4_ = fVar155 * fVar86;
  auVar17._0_4_ = fVar155 * fVar84;
  auVar17._8_4_ = fVar155 * fVar116;
  auVar17._12_4_ = fVar155 * fVar85;
  auVar17._16_4_ = fVar155 * 0.0;
  auVar17._20_4_ = fVar155 * 0.0;
  auVar17._24_4_ = fVar155 * 0.0;
  auVar17._28_4_ = fVar155;
  auVar61 = vfmadd231ps_fma(auVar17,auVar79,auVar183);
  auVar9 = vshufps_avx(auVar241,auVar241,0xaa);
  auVar184._0_8_ = auVar9._0_8_;
  auVar184._8_8_ = auVar184._0_8_;
  auVar184._16_8_ = auVar184._0_8_;
  auVar184._24_8_ = auVar184._0_8_;
  auVar122 = vshufps_avx(auVar241,auVar241,0xff);
  local_700._8_8_ = auVar122._0_8_;
  local_700._0_8_ = local_700._8_8_;
  local_700._16_8_ = local_700._8_8_;
  local_700._24_8_ = local_700._8_8_;
  fVar87 = auVar89._0_4_;
  fVar59 = auVar89._4_4_;
  auVar18._4_4_ = fVar59 * fVar86;
  auVar18._0_4_ = fVar87 * fVar84;
  auVar18._8_4_ = fVar87 * fVar116;
  auVar18._12_4_ = fVar59 * fVar85;
  auVar18._16_4_ = fVar87 * 0.0;
  auVar18._20_4_ = fVar59 * 0.0;
  auVar18._24_4_ = fVar87 * 0.0;
  auVar18._28_4_ = auVar8._4_4_;
  auVar142 = vfmadd231ps_fma(auVar18,auVar79,auVar200);
  auVar249._28_4_ = fVar59;
  auVar249._0_28_ =
       ZEXT1628(CONCAT412(auVar141._12_4_ * fVar85,
                          CONCAT48(auVar141._8_4_ * fVar116,
                                   CONCAT44(auVar141._4_4_ * fVar86,auVar141._0_4_ * fVar84))));
  auVar235 = vfmadd231ps_fma(auVar249,auVar79,ZEXT1632(auVar235));
  fVar87 = auVar122._4_4_;
  auVar19._28_4_ = fVar87;
  auVar19._0_28_ =
       ZEXT1628(CONCAT412(auVar119._12_4_ * fVar85,
                          CONCAT48(auVar119._8_4_ * fVar116,
                                   CONCAT44(auVar119._4_4_ * fVar86,auVar119._0_4_ * fVar84))));
  auVar131 = vfmadd231ps_fma(auVar19,auVar79,ZEXT1632(auVar131));
  auVar8 = vshufps_avx(auVar117,auVar117,0xaa);
  uVar88 = auVar8._0_8_;
  auVar171._8_8_ = uVar88;
  auVar171._0_8_ = uVar88;
  auVar171._16_8_ = uVar88;
  auVar171._24_8_ = uVar88;
  auVar89 = vshufps_avx(auVar117,auVar117,0xff);
  uVar88 = auVar89._0_8_;
  auVar277._8_8_ = uVar88;
  auVar277._0_8_ = uVar88;
  auVar277._16_8_ = uVar88;
  auVar277._24_8_ = uVar88;
  auVar117 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar61._12_4_ * fVar85,
                                                CONCAT48(auVar61._8_4_ * fVar116,
                                                         CONCAT44(auVar61._4_4_ * fVar86,
                                                                  auVar61._0_4_ * fVar84)))),auVar79
                             ,ZEXT1632(auVar141));
  auVar61 = vshufps_avx(auVar60,auVar60,0xaa);
  auVar241 = vshufps_avx(auVar60,auVar60,0xff);
  auVar60 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar142._12_4_,
                                               CONCAT48(fVar116 * auVar142._8_4_,
                                                        CONCAT44(fVar86 * auVar142._4_4_,
                                                                 fVar84 * auVar142._0_4_)))),auVar79
                            ,ZEXT1632(auVar119));
  auVar141 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar117._12_4_,
                                                CONCAT48(fVar116 * auVar117._8_4_,
                                                         CONCAT44(fVar86 * auVar117._4_4_,
                                                                  fVar84 * auVar117._0_4_)))),
                             auVar79,ZEXT1632(auVar235));
  auVar15 = vsubps_avx(ZEXT1632(auVar117),ZEXT1632(auVar235));
  auVar117 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar60._12_4_,
                                                CONCAT48(fVar116 * auVar60._8_4_,
                                                         CONCAT44(fVar86 * auVar60._4_4_,
                                                                  fVar84 * auVar60._0_4_)))),auVar79
                             ,ZEXT1632(auVar131));
  auVar80 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar131));
  fVar59 = auVar80._28_4_;
  auVar248._0_4_ = fStack_288 * auVar15._0_4_ * 3.0;
  auVar248._4_4_ = fStack_288 * auVar15._4_4_ * 3.0;
  auVar248._8_4_ = fStack_288 * auVar15._8_4_ * 3.0;
  auVar248._12_4_ = fStack_288 * auVar15._12_4_ * 3.0;
  auVar248._16_4_ = fStack_288 * auVar15._16_4_ * 3.0;
  auVar248._20_4_ = fStack_288 * auVar15._20_4_ * 3.0;
  auVar248._24_4_ = fStack_288 * auVar15._24_4_ * 3.0;
  auVar248._28_4_ = 0;
  local_5c0._0_4_ = fStack_288 * auVar80._0_4_ * 3.0;
  local_5c0._4_4_ = fStack_288 * auVar80._4_4_ * 3.0;
  fStack_5b8 = fStack_288 * auVar80._8_4_ * 3.0;
  fStack_5b4 = fStack_288 * auVar80._12_4_ * 3.0;
  fStack_5b0 = fStack_288 * auVar80._16_4_ * 3.0;
  fStack_5ac = fStack_288 * auVar80._20_4_ * 3.0;
  fStack_5a8 = fStack_288 * auVar80._24_4_ * 3.0;
  fStack_5a4 = fVar59;
  fVar155 = auVar9._0_4_;
  fVar221 = auVar9._4_4_;
  auVar20._4_4_ = fVar221 * fVar86;
  auVar20._0_4_ = fVar155 * fVar84;
  auVar20._8_4_ = fVar155 * fVar116;
  auVar20._12_4_ = fVar221 * fVar85;
  auVar20._16_4_ = fVar155 * 0.0;
  auVar20._20_4_ = fVar221 * 0.0;
  auVar20._24_4_ = fVar155 * 0.0;
  auVar20._28_4_ = fVar59;
  auVar9 = vfmadd231ps_fma(auVar20,auVar79,local_740);
  fVar155 = auVar122._0_4_;
  auVar21._4_4_ = fVar87 * fVar86;
  auVar21._0_4_ = fVar155 * fVar84;
  auVar21._8_4_ = fVar155 * fVar116;
  auVar21._12_4_ = fVar87 * fVar85;
  auVar21._16_4_ = fVar155 * 0.0;
  auVar21._20_4_ = fVar87 * 0.0;
  auVar21._24_4_ = fVar155 * 0.0;
  auVar21._28_4_ = 0;
  auVar122 = vfmadd231ps_fma(auVar21,auVar79,_local_780);
  fVar87 = auVar8._0_4_;
  fVar155 = auVar8._4_4_;
  auVar22._4_4_ = fVar155 * fVar86;
  auVar22._0_4_ = fVar87 * fVar84;
  auVar22._8_4_ = fVar87 * fVar116;
  auVar22._12_4_ = fVar155 * fVar85;
  auVar22._16_4_ = fVar87 * 0.0;
  auVar22._20_4_ = fVar155 * 0.0;
  auVar22._24_4_ = fVar87 * 0.0;
  auVar22._28_4_ = auVar15._28_4_;
  auVar8 = vfmadd231ps_fma(auVar22,auVar79,auVar184);
  fVar87 = auVar89._0_4_;
  fVar129 = auVar89._4_4_;
  auVar23._4_4_ = fVar129 * fVar86;
  auVar23._0_4_ = fVar87 * fVar84;
  auVar23._8_4_ = fVar87 * fVar116;
  auVar23._12_4_ = fVar129 * fVar85;
  auVar23._16_4_ = fVar87 * 0.0;
  auVar23._20_4_ = fVar129 * 0.0;
  auVar23._24_4_ = fVar87 * 0.0;
  auVar23._28_4_ = fVar221;
  auVar89 = vfmadd231ps_fma(auVar23,auVar79,local_700);
  auVar16 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar141));
  fVar87 = auVar61._0_4_;
  fVar155 = auVar61._4_4_;
  auVar24._4_4_ = fVar155 * fVar86;
  auVar24._0_4_ = fVar87 * fVar84;
  auVar24._8_4_ = fVar87 * fVar116;
  auVar24._12_4_ = fVar155 * fVar85;
  auVar24._16_4_ = fVar87 * 0.0;
  auVar24._20_4_ = fVar155 * 0.0;
  auVar24._24_4_ = fVar87 * 0.0;
  auVar24._28_4_ = fVar155;
  auVar61 = vfmadd231ps_fma(auVar24,auVar79,auVar171);
  auVar17 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar117));
  fVar87 = auVar241._0_4_;
  fVar155 = auVar241._4_4_;
  auVar25._4_4_ = fVar155 * fVar86;
  auVar25._0_4_ = fVar87 * fVar84;
  auVar25._8_4_ = fVar87 * fVar116;
  auVar25._12_4_ = fVar155 * fVar85;
  auVar25._16_4_ = fVar87 * 0.0;
  auVar25._20_4_ = fVar155 * 0.0;
  auVar25._24_4_ = fVar87 * 0.0;
  auVar25._28_4_ = fVar155;
  auVar241 = vfmadd231ps_fma(auVar25,auVar79,auVar277);
  auVar26._28_4_ = fVar129;
  auVar26._0_28_ =
       ZEXT1628(CONCAT412(auVar8._12_4_ * fVar85,
                          CONCAT48(auVar8._8_4_ * fVar116,
                                   CONCAT44(auVar8._4_4_ * fVar86,auVar8._0_4_ * fVar84))));
  auVar9 = vfmadd231ps_fma(auVar26,auVar79,ZEXT1632(auVar9));
  auVar122 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar89._12_4_,
                                                CONCAT48(fVar116 * auVar89._8_4_,
                                                         CONCAT44(fVar86 * auVar89._4_4_,
                                                                  fVar84 * auVar89._0_4_)))),auVar79
                             ,ZEXT1632(auVar122));
  auVar105._0_4_ = auVar141._0_4_ + auVar248._0_4_;
  auVar105._4_4_ = auVar141._4_4_ + auVar248._4_4_;
  auVar105._8_4_ = auVar141._8_4_ + auVar248._8_4_;
  auVar105._12_4_ = auVar141._12_4_ + auVar248._12_4_;
  auVar105._16_4_ = auVar248._16_4_ + 0.0;
  auVar105._20_4_ = auVar248._20_4_ + 0.0;
  auVar105._24_4_ = auVar248._24_4_ + 0.0;
  auVar105._28_4_ = 0;
  auVar8 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar61._12_4_ * fVar85,
                                              CONCAT48(auVar61._8_4_ * fVar116,
                                                       CONCAT44(auVar61._4_4_ * fVar86,
                                                                auVar61._0_4_ * fVar84)))),auVar79,
                           ZEXT1632(auVar8));
  auVar89 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar241._12_4_ * fVar85,
                                               CONCAT48(auVar241._8_4_ * fVar116,
                                                        CONCAT44(auVar241._4_4_ * fVar86,
                                                                 auVar241._0_4_ * fVar84)))),auVar79
                            ,ZEXT1632(auVar89));
  auVar61 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar85 * auVar8._12_4_,
                                               CONCAT48(fVar116 * auVar8._8_4_,
                                                        CONCAT44(fVar86 * auVar8._4_4_,
                                                                 fVar84 * auVar8._0_4_)))),auVar79,
                            ZEXT1632(auVar9));
  auVar241 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar89._12_4_ * fVar85,
                                                CONCAT48(auVar89._8_4_ * fVar116,
                                                         CONCAT44(auVar89._4_4_ * fVar86,
                                                                  auVar89._0_4_ * fVar84)))),
                             ZEXT1632(auVar122),auVar79);
  auVar79 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
  auVar15 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar122));
  auVar270._0_4_ = fStack_288 * auVar79._0_4_ * 3.0;
  auVar270._4_4_ = fStack_288 * auVar79._4_4_ * 3.0;
  auVar270._8_4_ = fStack_288 * auVar79._8_4_ * 3.0;
  auVar270._12_4_ = fStack_288 * auVar79._12_4_ * 3.0;
  auVar270._16_4_ = fStack_288 * auVar79._16_4_ * 3.0;
  auVar270._20_4_ = fStack_288 * auVar79._20_4_ * 3.0;
  auVar270._24_4_ = fStack_288 * auVar79._24_4_ * 3.0;
  auVar270._28_4_ = 0;
  local_2a0 = fStack_288 * auVar15._0_4_ * 3.0;
  fStack_29c = fStack_288 * auVar15._4_4_ * 3.0;
  auVar27._4_4_ = fStack_29c;
  auVar27._0_4_ = local_2a0;
  fStack_298 = fStack_288 * auVar15._8_4_ * 3.0;
  auVar27._8_4_ = fStack_298;
  fStack_294 = fStack_288 * auVar15._12_4_ * 3.0;
  auVar27._12_4_ = fStack_294;
  fStack_290 = fStack_288 * auVar15._16_4_ * 3.0;
  auVar27._16_4_ = fStack_290;
  fStack_28c = fStack_288 * auVar15._20_4_ * 3.0;
  auVar27._20_4_ = fStack_28c;
  fStack_288 = fStack_288 * auVar15._24_4_ * 3.0;
  auVar27._24_4_ = fStack_288;
  auVar27._28_4_ = 0x40400000;
  auVar18 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar61));
  local_4e0 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar241));
  auVar79 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar141));
  auVar15 = vsubps_avx(ZEXT1632(auVar241),ZEXT1632(auVar117));
  auVar80 = vsubps_avx(auVar18,auVar16);
  fVar261 = auVar79._0_4_ + auVar80._0_4_;
  fVar262 = auVar79._4_4_ + auVar80._4_4_;
  fVar186 = auVar79._8_4_ + auVar80._8_4_;
  fVar187 = auVar79._12_4_ + auVar80._12_4_;
  fVar188 = auVar79._16_4_ + auVar80._16_4_;
  fVar189 = auVar79._20_4_ + auVar80._20_4_;
  fVar190 = auVar79._24_4_ + auVar80._24_4_;
  auVar14 = vsubps_avx(local_4e0,auVar17);
  auVar81._0_4_ = auVar15._0_4_ + auVar14._0_4_;
  auVar81._4_4_ = auVar15._4_4_ + auVar14._4_4_;
  auVar81._8_4_ = auVar15._8_4_ + auVar14._8_4_;
  auVar81._12_4_ = auVar15._12_4_ + auVar14._12_4_;
  auVar81._16_4_ = auVar15._16_4_ + auVar14._16_4_;
  auVar81._20_4_ = auVar15._20_4_ + auVar14._20_4_;
  auVar81._24_4_ = auVar15._24_4_ + auVar14._24_4_;
  auVar81._28_4_ = auVar15._28_4_ + auVar14._28_4_;
  local_240 = ZEXT1632(auVar117);
  fVar84 = auVar117._0_4_;
  local_2c0 = (float)local_5c0._0_4_ + fVar84;
  fVar86 = auVar117._4_4_;
  fStack_2bc = (float)local_5c0._4_4_ + fVar86;
  fVar116 = auVar117._8_4_;
  fStack_2b8 = fStack_5b8 + fVar116;
  fVar85 = auVar117._12_4_;
  fStack_2b4 = fStack_5b4 + fVar85;
  fStack_2b0 = fStack_5b0 + 0.0;
  fStack_2ac = fStack_5ac + 0.0;
  fStack_2a8 = fStack_5a8 + 0.0;
  local_200 = ZEXT1632(auVar141);
  auVar15 = vsubps_avx(local_200,auVar248);
  local_220 = vpermps_avx2(_DAT_01fb7720,auVar15);
  auVar15 = vsubps_avx(local_240,_local_5c0);
  local_2e0 = vpermps_avx2(_DAT_01fb7720,auVar15);
  local_260._0_4_ = auVar61._0_4_ + auVar270._0_4_;
  local_260._4_4_ = auVar61._4_4_ + auVar270._4_4_;
  local_260._8_4_ = auVar61._8_4_ + auVar270._8_4_;
  local_260._12_4_ = auVar61._12_4_ + auVar270._12_4_;
  local_260._16_4_ = auVar270._16_4_ + 0.0;
  local_260._20_4_ = auVar270._20_4_ + 0.0;
  local_260._24_4_ = auVar270._24_4_ + 0.0;
  local_260._28_4_ = 0;
  auVar249 = ZEXT1632(auVar61);
  auVar15 = vsubps_avx(auVar249,auVar270);
  _local_5c0 = vpermps_avx2(_DAT_01fb7720,auVar15);
  fVar87 = auVar241._0_4_;
  local_2a0 = fVar87 + local_2a0;
  fVar155 = auVar241._4_4_;
  fStack_29c = fVar155 + fStack_29c;
  fVar221 = auVar241._8_4_;
  fStack_298 = fVar221 + fStack_298;
  fVar129 = auVar241._12_4_;
  fStack_294 = fVar129 + fStack_294;
  fStack_290 = fStack_290 + 0.0;
  fStack_28c = fStack_28c + 0.0;
  fStack_288 = fStack_288 + 0.0;
  auVar15 = vsubps_avx(ZEXT1632(auVar241),auVar27);
  local_280 = vpermps_avx2(_DAT_01fb7720,auVar15);
  auVar28._4_4_ = fVar86 * fVar262;
  auVar28._0_4_ = fVar84 * fVar261;
  auVar28._8_4_ = fVar116 * fVar186;
  auVar28._12_4_ = fVar85 * fVar187;
  auVar28._16_4_ = fVar188 * 0.0;
  auVar28._20_4_ = fVar189 * 0.0;
  auVar28._24_4_ = fVar190 * 0.0;
  auVar28._28_4_ = auVar15._28_4_;
  auVar8 = vfnmadd231ps_fma(auVar28,local_200,auVar81);
  fStack_2a4 = fVar59 + 0.0;
  auVar29._4_4_ = fStack_2bc * fVar262;
  auVar29._0_4_ = local_2c0 * fVar261;
  auVar29._8_4_ = fStack_2b8 * fVar186;
  auVar29._12_4_ = fStack_2b4 * fVar187;
  auVar29._16_4_ = fStack_2b0 * fVar188;
  auVar29._20_4_ = fStack_2ac * fVar189;
  auVar29._24_4_ = fStack_2a8 * fVar190;
  auVar29._28_4_ = 0;
  auVar9 = vfnmadd231ps_fma(auVar29,auVar81,auVar105);
  auVar30._4_4_ = local_2e0._4_4_ * fVar262;
  auVar30._0_4_ = local_2e0._0_4_ * fVar261;
  auVar30._8_4_ = local_2e0._8_4_ * fVar186;
  auVar30._12_4_ = local_2e0._12_4_ * fVar187;
  auVar30._16_4_ = local_2e0._16_4_ * fVar188;
  auVar30._20_4_ = local_2e0._20_4_ * fVar189;
  auVar30._24_4_ = local_2e0._24_4_ * fVar190;
  auVar30._28_4_ = fVar59 + 0.0;
  auVar122 = vfnmadd231ps_fma(auVar30,local_220,auVar81);
  local_780._0_4_ = auVar17._0_4_;
  local_780._4_4_ = auVar17._4_4_;
  uStack_778._0_4_ = auVar17._8_4_;
  uStack_778._4_4_ = auVar17._12_4_;
  uStack_770._0_4_ = auVar17._16_4_;
  uStack_770._4_4_ = auVar17._20_4_;
  uStack_768._0_4_ = auVar17._24_4_;
  uStack_768._4_4_ = auVar17._28_4_;
  auVar31._4_4_ = (float)local_780._4_4_ * fVar262;
  auVar31._0_4_ = (float)local_780._0_4_ * fVar261;
  auVar31._8_4_ = (float)uStack_778 * fVar186;
  auVar31._12_4_ = uStack_778._4_4_ * fVar187;
  auVar31._16_4_ = (float)uStack_770 * fVar188;
  auVar31._20_4_ = uStack_770._4_4_ * fVar189;
  auVar31._24_4_ = (float)uStack_768 * fVar190;
  auVar31._28_4_ = uStack_768._4_4_;
  auVar89 = vfnmadd231ps_fma(auVar31,auVar16,auVar81);
  auVar201._0_4_ = fVar87 * fVar261;
  auVar201._4_4_ = fVar155 * fVar262;
  auVar201._8_4_ = fVar221 * fVar186;
  auVar201._12_4_ = fVar129 * fVar187;
  auVar201._16_4_ = fVar188 * 0.0;
  auVar201._20_4_ = fVar189 * 0.0;
  auVar201._24_4_ = fVar190 * 0.0;
  auVar201._28_4_ = 0;
  auVar61 = vfnmadd231ps_fma(auVar201,auVar249,auVar81);
  uStack_284 = 0x40400000;
  auVar32._4_4_ = fStack_29c * fVar262;
  auVar32._0_4_ = local_2a0 * fVar261;
  auVar32._8_4_ = fStack_298 * fVar186;
  auVar32._12_4_ = fStack_294 * fVar187;
  auVar32._16_4_ = fStack_290 * fVar188;
  auVar32._20_4_ = fStack_28c * fVar189;
  auVar32._24_4_ = fStack_288 * fVar190;
  auVar32._28_4_ = auVar16._28_4_;
  auVar117 = vfnmadd231ps_fma(auVar32,local_260,auVar81);
  auVar33._4_4_ = local_280._4_4_ * fVar262;
  auVar33._0_4_ = local_280._0_4_ * fVar261;
  auVar33._8_4_ = local_280._8_4_ * fVar186;
  auVar33._12_4_ = local_280._12_4_ * fVar187;
  auVar33._16_4_ = local_280._16_4_ * fVar188;
  auVar33._20_4_ = local_280._20_4_ * fVar189;
  auVar33._24_4_ = local_280._24_4_ * fVar190;
  auVar33._28_4_ = local_280._28_4_;
  auVar60 = vfnmadd231ps_fma(auVar33,_local_5c0,auVar81);
  auVar34._4_4_ = local_4e0._4_4_ * fVar262;
  auVar34._0_4_ = local_4e0._0_4_ * fVar261;
  auVar34._8_4_ = local_4e0._8_4_ * fVar186;
  auVar34._12_4_ = local_4e0._12_4_ * fVar187;
  auVar34._16_4_ = local_4e0._16_4_ * fVar188;
  auVar34._20_4_ = local_4e0._20_4_ * fVar189;
  auVar34._24_4_ = local_4e0._24_4_ * fVar190;
  auVar34._28_4_ = auVar79._28_4_ + auVar80._28_4_;
  auVar219 = ZEXT3264(auVar18);
  auVar235 = vfnmadd231ps_fma(auVar34,auVar18,auVar81);
  auVar15 = vminps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
  auVar79 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
  auVar80 = vminps_avx(ZEXT1632(auVar122),ZEXT1632(auVar89));
  auVar80 = vminps_avx(auVar15,auVar80);
  auVar15 = vmaxps_avx(ZEXT1632(auVar122),ZEXT1632(auVar89));
  auVar79 = vmaxps_avx(auVar79,auVar15);
  auVar14 = vminps_avx(ZEXT1632(auVar61),ZEXT1632(auVar117));
  auVar15 = vmaxps_avx(ZEXT1632(auVar61),ZEXT1632(auVar117));
  auVar10 = vminps_avx(ZEXT1632(auVar60),ZEXT1632(auVar235));
  auVar14 = vminps_avx(auVar14,auVar10);
  auVar14 = vminps_avx(auVar80,auVar14);
  auVar80 = vmaxps_avx(ZEXT1632(auVar60),ZEXT1632(auVar235));
  auVar15 = vmaxps_avx(auVar15,auVar80);
  auVar15 = vmaxps_avx(auVar79,auVar15);
  auVar45._4_4_ = fStack_1bc;
  auVar45._0_4_ = local_1c0;
  auVar45._8_4_ = fStack_1b8;
  auVar45._12_4_ = fStack_1b4;
  auVar45._16_4_ = fStack_1b0;
  auVar45._20_4_ = fStack_1ac;
  auVar45._24_4_ = fStack_1a8;
  auVar45._28_4_ = fStack_1a4;
  auVar79 = vcmpps_avx(auVar14,auVar45,2);
  auVar44._4_4_ = fStack_1dc;
  auVar44._0_4_ = local_1e0;
  auVar44._8_4_ = fStack_1d8;
  auVar44._12_4_ = fStack_1d4;
  auVar44._16_4_ = fStack_1d0;
  auVar44._20_4_ = fStack_1cc;
  auVar44._24_4_ = fStack_1c8;
  auVar44._28_4_ = fStack_1c4;
  auVar15 = vcmpps_avx(auVar15,auVar44,5);
  auVar79 = vandps_avx(auVar15,auVar79);
  auVar15 = local_300 & auVar79;
  if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0x7f,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar15 >> 0xbf,0) != '\0') ||
      (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0') {
    auVar15 = vsubps_avx(auVar16,local_200);
    auVar80 = vsubps_avx(auVar18,auVar249);
    fVar261 = auVar15._0_4_ + auVar80._0_4_;
    fVar262 = auVar15._4_4_ + auVar80._4_4_;
    fVar186 = auVar15._8_4_ + auVar80._8_4_;
    fVar187 = auVar15._12_4_ + auVar80._12_4_;
    fVar188 = auVar15._16_4_ + auVar80._16_4_;
    fVar189 = auVar15._20_4_ + auVar80._20_4_;
    fVar190 = auVar15._24_4_ + auVar80._24_4_;
    auVar14 = vsubps_avx(auVar17,local_240);
    auVar10 = vsubps_avx(local_4e0,ZEXT1632(auVar241));
    auVar106._0_4_ = auVar14._0_4_ + auVar10._0_4_;
    auVar106._4_4_ = auVar14._4_4_ + auVar10._4_4_;
    auVar106._8_4_ = auVar14._8_4_ + auVar10._8_4_;
    auVar106._12_4_ = auVar14._12_4_ + auVar10._12_4_;
    auVar106._16_4_ = auVar14._16_4_ + auVar10._16_4_;
    auVar106._20_4_ = auVar14._20_4_ + auVar10._20_4_;
    auVar106._24_4_ = auVar14._24_4_ + auVar10._24_4_;
    fVar59 = auVar10._28_4_;
    auVar106._28_4_ = auVar14._28_4_ + fVar59;
    auVar35._4_4_ = fVar86 * fVar262;
    auVar35._0_4_ = fVar84 * fVar261;
    auVar35._8_4_ = fVar116 * fVar186;
    auVar35._12_4_ = fVar85 * fVar187;
    auVar35._16_4_ = fVar188 * 0.0;
    auVar35._20_4_ = fVar189 * 0.0;
    auVar35._24_4_ = fVar190 * 0.0;
    auVar35._28_4_ = local_4e0._28_4_;
    auVar61 = vfnmadd231ps_fma(auVar35,auVar106,local_200);
    auVar36._4_4_ = fVar262 * fStack_2bc;
    auVar36._0_4_ = fVar261 * local_2c0;
    auVar36._8_4_ = fVar186 * fStack_2b8;
    auVar36._12_4_ = fVar187 * fStack_2b4;
    auVar36._16_4_ = fVar188 * fStack_2b0;
    auVar36._20_4_ = fVar189 * fStack_2ac;
    auVar36._24_4_ = fVar190 * fStack_2a8;
    auVar36._28_4_ = 0;
    auVar8 = vfnmadd213ps_fma(auVar105,auVar106,auVar36);
    auVar37._4_4_ = fVar262 * local_2e0._4_4_;
    auVar37._0_4_ = fVar261 * local_2e0._0_4_;
    auVar37._8_4_ = fVar186 * local_2e0._8_4_;
    auVar37._12_4_ = fVar187 * local_2e0._12_4_;
    auVar37._16_4_ = fVar188 * local_2e0._16_4_;
    auVar37._20_4_ = fVar189 * local_2e0._20_4_;
    auVar37._24_4_ = fVar190 * local_2e0._24_4_;
    auVar37._28_4_ = 0;
    auVar9 = vfnmadd213ps_fma(local_220,auVar106,auVar37);
    auVar38._4_4_ = (float)local_780._4_4_ * fVar262;
    auVar38._0_4_ = (float)local_780._0_4_ * fVar261;
    auVar38._8_4_ = (float)uStack_778 * fVar186;
    auVar38._12_4_ = uStack_778._4_4_ * fVar187;
    auVar38._16_4_ = (float)uStack_770 * fVar188;
    auVar38._20_4_ = uStack_770._4_4_ * fVar189;
    auVar38._24_4_ = (float)uStack_768 * fVar190;
    auVar38._28_4_ = 0;
    auVar241 = vfnmadd231ps_fma(auVar38,auVar106,auVar16);
    auVar127._0_4_ = fVar87 * fVar261;
    auVar127._4_4_ = fVar155 * fVar262;
    auVar127._8_4_ = fVar221 * fVar186;
    auVar127._12_4_ = fVar129 * fVar187;
    auVar127._16_4_ = fVar188 * 0.0;
    auVar127._20_4_ = fVar189 * 0.0;
    auVar127._24_4_ = fVar190 * 0.0;
    auVar127._28_4_ = 0;
    auVar117 = vfnmadd231ps_fma(auVar127,auVar106,auVar249);
    auVar39._4_4_ = fVar262 * fStack_29c;
    auVar39._0_4_ = fVar261 * local_2a0;
    auVar39._8_4_ = fVar186 * fStack_298;
    auVar39._12_4_ = fVar187 * fStack_294;
    auVar39._16_4_ = fVar188 * fStack_290;
    auVar39._20_4_ = fVar189 * fStack_28c;
    auVar39._24_4_ = fVar190 * fStack_288;
    auVar39._28_4_ = fVar59;
    auVar122 = vfnmadd213ps_fma(local_260,auVar106,auVar39);
    auVar40._4_4_ = fVar262 * local_280._4_4_;
    auVar40._0_4_ = fVar261 * local_280._0_4_;
    auVar40._8_4_ = fVar186 * local_280._8_4_;
    auVar40._12_4_ = fVar187 * local_280._12_4_;
    auVar40._16_4_ = fVar188 * local_280._16_4_;
    auVar40._20_4_ = fVar189 * local_280._20_4_;
    auVar40._24_4_ = fVar190 * local_280._24_4_;
    auVar40._28_4_ = fVar59;
    auVar89 = vfnmadd213ps_fma(_local_5c0,auVar106,auVar40);
    auVar219 = ZEXT1664(auVar89);
    auVar41._4_4_ = fVar262 * local_4e0._4_4_;
    auVar41._0_4_ = fVar261 * local_4e0._0_4_;
    auVar41._8_4_ = fVar186 * local_4e0._8_4_;
    auVar41._12_4_ = fVar187 * local_4e0._12_4_;
    auVar41._16_4_ = fVar188 * local_4e0._16_4_;
    auVar41._20_4_ = fVar189 * local_4e0._20_4_;
    auVar41._24_4_ = fVar190 * local_4e0._24_4_;
    auVar41._28_4_ = auVar15._28_4_ + auVar80._28_4_;
    auVar60 = vfnmadd231ps_fma(auVar41,auVar106,auVar18);
    auVar80 = vminps_avx(ZEXT1632(auVar61),ZEXT1632(auVar8));
    auVar15 = vmaxps_avx(ZEXT1632(auVar61),ZEXT1632(auVar8));
    auVar14 = vminps_avx(ZEXT1632(auVar9),ZEXT1632(auVar241));
    auVar14 = vminps_avx(auVar80,auVar14);
    auVar80 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar241));
    auVar15 = vmaxps_avx(auVar15,auVar80);
    auVar10 = vminps_avx(ZEXT1632(auVar117),ZEXT1632(auVar122));
    auVar80 = vmaxps_avx(ZEXT1632(auVar117),ZEXT1632(auVar122));
    auVar16 = vminps_avx(ZEXT1632(auVar89),ZEXT1632(auVar60));
    auVar10 = vminps_avx(auVar10,auVar16);
    auVar10 = vminps_avx(auVar14,auVar10);
    auVar14 = vmaxps_avx(ZEXT1632(auVar89),ZEXT1632(auVar60));
    auVar80 = vmaxps_avx(auVar80,auVar14);
    auVar80 = vmaxps_avx(auVar15,auVar80);
    auVar15 = vcmpps_avx(auVar10,auVar45,2);
    auVar80 = vcmpps_avx(auVar80,auVar44,5);
    auVar15 = vandps_avx(auVar80,auVar15);
    auVar79 = vandps_avx(auVar79,local_300);
    auVar80 = auVar79 & auVar15;
    if ((((((((auVar80 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar80 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar80 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar80 >> 0x7f,0) != '\0') ||
          (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar80 >> 0xbf,0) != '\0') ||
        (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar80[0x1f] < '\0')
    {
      auVar79 = vandps_avx(auVar15,auVar79);
      uVar56 = vmovmskps_avx(auVar79);
      if (uVar56 != 0) {
        auStack_4f0[uVar50] = uVar56 & 0xff;
        uVar88 = vmovlps_avx(local_440);
        *(undefined8 *)(&uStack_380 + uVar50 * 2) = uVar88;
        uVar55 = vmovlps_avx(auVar66);
        auStack_1a0[uVar50] = uVar55;
        uVar50 = (ulong)((int)uVar50 + 1);
      }
    }
  }
LAB_0115f5f3:
  if ((int)uVar50 == 0) {
    uVar57 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar78._4_4_ = uVar57;
    auVar78._0_4_ = uVar57;
    auVar78._8_4_ = uVar57;
    auVar78._12_4_ = uVar57;
    auVar8 = vcmpps_avx(local_490,auVar78,2);
    uVar48 = vmovmskps_avx(auVar8);
    uVar49 = (ulong)((uint)uVar49 & local_5f8 & uVar48);
    goto LAB_0115e8c8;
  }
  uVar47 = (int)uVar50 - 1;
  uVar51 = (ulong)uVar47;
  uVar54 = auStack_4f0[uVar51];
  uVar56 = (&uStack_380)[uVar51 * 2];
  fVar84 = afStack_37c[uVar51 * 2];
  iVar46 = 0;
  for (uVar55 = (ulong)uVar54; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
    iVar46 = iVar46 + 1;
  }
  uVar54 = uVar54 - 1 & uVar54;
  if (uVar54 == 0) {
    uVar50 = (ulong)uVar47;
  }
  auVar66._8_8_ = 0;
  auVar66._0_8_ = auStack_1a0[uVar51];
  auStack_4f0[uVar51] = uVar54;
  fVar86 = (float)(iVar46 + 1) * 0.14285715;
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar84 * (float)iVar46 * 0.14285715)),ZEXT416(uVar56),
                           ZEXT416((uint)(1.0 - (float)iVar46 * 0.14285715)));
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar84 * fVar86)),ZEXT416(uVar56),
                           ZEXT416((uint)(1.0 - fVar86)));
  fVar86 = auVar9._0_4_;
  auVar185._0_4_ = auVar8._0_4_;
  fVar84 = fVar86 - auVar185._0_4_;
  if (fVar84 < 0.16666667) {
    auVar122 = vshufps_avx(auVar66,auVar66,0x50);
    auVar94._8_4_ = 0x3f800000;
    auVar94._0_8_ = 0x3f8000003f800000;
    auVar94._12_4_ = 0x3f800000;
    auVar89 = vsubps_avx(auVar94,auVar122);
    fVar116 = auVar122._0_4_;
    auVar135._0_4_ = fVar116 * fVar130;
    fVar85 = auVar122._4_4_;
    auVar135._4_4_ = fVar85 * fVar140;
    fVar87 = auVar122._8_4_;
    auVar135._8_4_ = fVar87 * fVar130;
    fVar59 = auVar122._12_4_;
    auVar135._12_4_ = fVar59 * fVar140;
    auVar145._0_4_ = fVar116 * fVar250;
    auVar145._4_4_ = fVar85 * fVar260;
    auVar145._8_4_ = fVar87 * fVar250;
    auVar145._12_4_ = fVar59 * fVar260;
    auVar167._0_4_ = fVar116 * fVar191;
    auVar167._4_4_ = fVar85 * fVar202;
    auVar167._8_4_ = fVar87 * fVar191;
    auVar167._12_4_ = fVar59 * fVar202;
    auVar68._0_4_ = fVar116 * fVar203;
    auVar68._4_4_ = fVar85 * fVar220;
    auVar68._8_4_ = fVar87 * fVar203;
    auVar68._12_4_ = fVar59 * fVar220;
    auVar122 = vfmadd231ps_fma(auVar135,auVar89,auVar179);
    auVar61 = vfmadd231ps_fma(auVar145,auVar89,auVar225);
    auVar241 = vfmadd231ps_fma(auVar167,auVar89,auVar240);
    auVar89 = vfmadd231ps_fma(auVar68,auVar89,auVar253);
    auVar128._16_16_ = auVar122;
    auVar128._0_16_ = auVar122;
    auVar139._16_16_ = auVar61;
    auVar139._0_16_ = auVar61;
    auVar153._16_16_ = auVar241;
    auVar153._0_16_ = auVar241;
    auVar185._4_4_ = auVar185._0_4_;
    auVar185._8_4_ = auVar185._0_4_;
    auVar185._12_4_ = auVar185._0_4_;
    auVar185._20_4_ = fVar86;
    auVar185._16_4_ = fVar86;
    auVar185._24_4_ = fVar86;
    auVar185._28_4_ = fVar86;
    auVar79 = vsubps_avx(auVar139,auVar128);
    auVar61 = vfmadd213ps_fma(auVar79,auVar185,auVar128);
    auVar79 = vsubps_avx(auVar153,auVar139);
    auVar117 = vfmadd213ps_fma(auVar79,auVar185,auVar139);
    auVar122 = vsubps_avx(auVar89,auVar241);
    auVar82._16_16_ = auVar122;
    auVar82._0_16_ = auVar122;
    auVar122 = vfmadd213ps_fma(auVar82,auVar185,auVar153);
    auVar79 = vsubps_avx(ZEXT1632(auVar117),ZEXT1632(auVar61));
    auVar89 = vfmadd213ps_fma(auVar79,auVar185,ZEXT1632(auVar61));
    auVar79 = vsubps_avx(ZEXT1632(auVar122),ZEXT1632(auVar117));
    auVar122 = vfmadd213ps_fma(auVar79,auVar185,ZEXT1632(auVar117));
    auVar79 = vsubps_avx(ZEXT1632(auVar122),ZEXT1632(auVar89));
    auVar131 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar79,auVar185);
    fVar221 = auVar79._4_4_ * 3.0;
    fVar116 = fVar84 * 0.33333334;
    local_4e0._0_8_ =
         CONCAT44(auVar131._4_4_ + fVar116 * fVar221,auVar131._0_4_ + fVar116 * auVar79._0_4_ * 3.0)
    ;
    local_4e0._8_4_ = auVar131._8_4_ + fVar116 * auVar79._8_4_ * 3.0;
    local_4e0._12_4_ = auVar131._12_4_ + fVar116 * auVar79._12_4_ * 3.0;
    auVar89 = vshufpd_avx(auVar131,auVar131,3);
    auVar61 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
    auVar122 = vsubps_avx(auVar89,auVar131);
    auVar241 = vsubps_avx(auVar61,(undefined1  [16])0x0);
    auVar69._0_4_ = auVar122._0_4_ + auVar241._0_4_;
    auVar69._4_4_ = auVar122._4_4_ + auVar241._4_4_;
    auVar69._8_4_ = auVar122._8_4_ + auVar241._8_4_;
    auVar69._12_4_ = auVar122._12_4_ + auVar241._12_4_;
    auVar122 = vshufps_avx(auVar131,auVar131,0xb1);
    auVar241 = vshufps_avx(local_4e0._0_16_,local_4e0._0_16_,0xb1);
    auVar266._4_4_ = auVar69._0_4_;
    auVar266._0_4_ = auVar69._0_4_;
    auVar266._8_4_ = auVar69._0_4_;
    auVar266._12_4_ = auVar69._0_4_;
    auVar117 = vshufps_avx(auVar69,auVar69,0x55);
    fVar85 = auVar117._0_4_;
    auVar70._0_4_ = fVar85 * auVar122._0_4_;
    fVar87 = auVar117._4_4_;
    auVar70._4_4_ = fVar87 * auVar122._4_4_;
    fVar59 = auVar117._8_4_;
    auVar70._8_4_ = fVar59 * auVar122._8_4_;
    fVar155 = auVar117._12_4_;
    auVar70._12_4_ = fVar155 * auVar122._12_4_;
    auVar146._0_4_ = fVar85 * auVar241._0_4_;
    auVar146._4_4_ = fVar87 * auVar241._4_4_;
    auVar146._8_4_ = fVar59 * auVar241._8_4_;
    auVar146._12_4_ = fVar155 * auVar241._12_4_;
    auVar60 = vfmadd231ps_fma(auVar70,auVar266,auVar131);
    auVar235 = vfmadd231ps_fma(auVar146,auVar266,local_4e0._0_16_);
    auVar241 = vshufps_avx(auVar60,auVar60,0xe8);
    auVar117 = vshufps_avx(auVar235,auVar235,0xe8);
    auVar122 = vcmpps_avx(auVar241,auVar117,1);
    uVar56 = vextractps_avx(auVar122,0);
    auVar141 = auVar235;
    if ((uVar56 & 1) == 0) {
      auVar141 = auVar60;
    }
    auVar118._0_4_ = fVar116 * auVar79._16_4_ * 3.0;
    auVar118._4_4_ = fVar116 * fVar221;
    auVar118._8_4_ = fVar116 * auVar79._24_4_ * 3.0;
    auVar118._12_4_ = fVar116 * auVar219._28_4_;
    auVar175 = vsubps_avx((undefined1  [16])0x0,auVar118);
    auVar119 = vshufps_avx(auVar175,auVar175,0xb1);
    auVar142 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
    auVar180._0_4_ = fVar85 * auVar119._0_4_;
    auVar180._4_4_ = fVar87 * auVar119._4_4_;
    auVar180._8_4_ = fVar59 * auVar119._8_4_;
    auVar180._12_4_ = fVar155 * auVar119._12_4_;
    auVar195._0_4_ = auVar142._0_4_ * fVar85;
    auVar195._4_4_ = auVar142._4_4_ * fVar87;
    auVar195._8_4_ = auVar142._8_4_ * fVar59;
    auVar195._12_4_ = auVar142._12_4_ * fVar155;
    _local_5c0 = auVar175;
    auVar176 = vfmadd231ps_fma(auVar180,auVar266,auVar175);
    auVar204 = vfmadd231ps_fma(auVar195,(undefined1  [16])0x0,auVar266);
    auVar142 = vshufps_avx(auVar176,auVar176,0xe8);
    auVar156 = vshufps_avx(auVar204,auVar204,0xe8);
    auVar219 = ZEXT1664(auVar156);
    auVar119 = vcmpps_avx(auVar142,auVar156,1);
    uVar56 = vextractps_avx(auVar119,0);
    auVar205 = auVar204;
    if ((uVar56 & 1) == 0) {
      auVar205 = auVar176;
    }
    auVar141 = vmaxss_avx(auVar205,auVar141);
    auVar241 = vminps_avx(auVar241,auVar117);
    auVar117 = vminps_avx(auVar142,auVar156);
    auVar117 = vminps_avx(auVar241,auVar117);
    auVar122 = vshufps_avx(auVar122,auVar122,0x55);
    auVar122 = vblendps_avx(auVar122,auVar119,2);
    auVar119 = vpslld_avx(auVar122,0x1f);
    auVar122 = vshufpd_avx(auVar235,auVar235,1);
    auVar122 = vinsertps_avx(auVar122,auVar204,0x9c);
    auVar241 = vshufpd_avx(auVar60,auVar60,1);
    auVar241 = vinsertps_avx(auVar241,auVar176,0x9c);
    auVar122 = vblendvps_avx(auVar241,auVar122,auVar119);
    auVar241 = vmovshdup_avx(auVar122);
    auVar122 = vmaxss_avx(auVar241,auVar122);
    fVar59 = auVar117._0_4_;
    auVar241 = vmovshdup_avx(auVar117);
    fVar87 = auVar122._0_4_;
    fVar116 = auVar241._0_4_;
    fVar85 = auVar141._0_4_;
    if (((0.0001 <= fVar59) || (fVar87 <= -0.0001)) && (0.0001 <= fVar116 || fVar87 <= -0.0001))
    goto code_r0x0115f8fe;
    goto LAB_0115f924;
  }
  local_440 = vinsertps_avx(auVar8,auVar9,0x10);
  goto LAB_0115f050;
code_r0x0115f8fe:
  auVar241 = vcmpps_avx(auVar241,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar60 = vcmpps_avx(auVar117,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar241 = vandps_avx(auVar60,auVar241);
  if (fVar85 <= -0.0001 || (auVar241 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_0115f5f3;
LAB_0115f924:
  auVar60 = vcmpps_avx(auVar117,_DAT_01f45a50,1);
  auVar235 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar241 = vcmpss_avx(auVar141,ZEXT816(0) << 0x20,1);
  auVar95._8_4_ = 0x3f800000;
  auVar95._0_8_ = 0x3f8000003f800000;
  auVar95._12_4_ = 0x3f800000;
  auVar110._8_4_ = 0xbf800000;
  auVar110._0_8_ = 0xbf800000bf800000;
  auVar110._12_4_ = 0xbf800000;
  auVar241 = vblendvps_avx(auVar95,auVar110,auVar241);
  auVar60 = vblendvps_avx(auVar95,auVar110,auVar60);
  fVar221 = auVar60._0_4_;
  fVar155 = auVar241._0_4_;
  auVar241 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar221 == fVar155) && (!NAN(fVar221) && !NAN(fVar155))) {
    auVar241 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar221 == fVar155) && (!NAN(fVar221) && !NAN(fVar155))) {
    auVar235 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar60 = vmovshdup_avx(auVar60);
  fVar129 = auVar60._0_4_;
  if ((fVar221 != fVar129) || (NAN(fVar221) || NAN(fVar129))) {
    if ((fVar116 != fVar59) || (NAN(fVar116) || NAN(fVar59))) {
      auVar120._0_4_ = (float)((uint)fVar59 ^ local_510);
      auVar120._4_4_ = auVar117._4_4_ ^ uStack_50c;
      auVar120._8_4_ = auVar117._8_4_ ^ uStack_508;
      auVar120._12_4_ = auVar117._12_4_ ^ uStack_504;
      auVar121._0_4_ = auVar120._0_4_ / (fVar116 - fVar59);
      auVar121._4_12_ = auVar120._4_12_;
      auVar117 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar121._0_4_)),auVar121,ZEXT416(0));
      auVar60 = auVar117;
    }
    else {
      auVar117 = ZEXT816(0) << 0x20;
      if ((fVar59 != 0.0) || (auVar60 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar59))) {
        auVar117 = SUB6416(ZEXT464(0x7f800000),0);
        auVar60 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar241 = vminss_avx(auVar241,auVar117);
    auVar235 = vmaxss_avx(auVar60,auVar235);
  }
  auVar122 = vcmpss_avx(auVar122,ZEXT416(0),1);
  auVar96._8_4_ = 0x3f800000;
  auVar96._0_8_ = 0x3f8000003f800000;
  auVar96._12_4_ = 0x3f800000;
  auVar111._8_4_ = 0xbf800000;
  auVar111._0_8_ = 0xbf800000bf800000;
  auVar111._12_4_ = 0xbf800000;
  auVar122 = vblendvps_avx(auVar96,auVar111,auVar122);
  fVar116 = auVar122._0_4_;
  if ((fVar155 != fVar116) || (NAN(fVar155) || NAN(fVar116))) {
    if ((fVar87 != fVar85) || (NAN(fVar87) || NAN(fVar85))) {
      auVar71._0_4_ = (float)((uint)fVar85 ^ local_510);
      auVar71._4_4_ = auVar141._4_4_ ^ uStack_50c;
      auVar71._8_4_ = auVar141._8_4_ ^ uStack_508;
      auVar71._12_4_ = auVar141._12_4_ ^ uStack_504;
      auVar123._0_4_ = auVar71._0_4_ / (fVar87 - fVar85);
      auVar123._4_12_ = auVar71._4_12_;
      auVar122 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar123._0_4_)),auVar123,ZEXT416(0));
      auVar117 = auVar122;
    }
    else {
      auVar122 = SUB6416(ZEXT464(0x3f800000),0);
      if ((fVar85 != 0.0) || (auVar117 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar85))) {
        auVar122 = SUB6416(ZEXT464(0xff800000),0);
        auVar117 = SUB6416(ZEXT464(0x7f800000),0);
      }
    }
    auVar241 = vminss_avx(auVar241,auVar117);
    auVar235 = vmaxss_avx(auVar122,auVar235);
  }
  if ((fVar129 != fVar116) || (NAN(fVar129) || NAN(fVar116))) {
    auVar241 = vminss_avx(auVar241,SUB6416(ZEXT464(0x3f800000),0));
    auVar235 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar235);
  }
  auVar122 = vmaxss_avx(ZEXT816(0) << 0x40,auVar241);
  auVar241 = vminss_avx(auVar235,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar241._0_4_ < auVar122._0_4_) goto LAB_0115f5f3;
  auVar122 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar122._0_4_ + -0.1)));
  auVar241 = vminss_avx(ZEXT416((uint)(auVar241._0_4_ + 0.1)),SUB6416(ZEXT464(0x3f800000),0));
  auVar136._0_8_ = auVar131._0_8_;
  auVar136._8_8_ = auVar136._0_8_;
  auVar211._8_8_ = local_4e0._0_8_;
  auVar211._0_8_ = local_4e0._0_8_;
  auVar226._8_8_ = auVar175._0_8_;
  auVar226._0_8_ = auVar175._0_8_;
  auVar117 = vshufpd_avx(local_4e0._0_16_,local_4e0._0_16_,3);
  auVar60 = vshufpd_avx(auVar175,auVar175,3);
  auVar235 = vshufps_avx(auVar122,auVar241,0);
  auVar72._8_4_ = 0x3f800000;
  auVar72._0_8_ = 0x3f8000003f800000;
  auVar72._12_4_ = 0x3f800000;
  auVar131 = vsubps_avx(auVar72,auVar235);
  local_6e0 = auVar89._0_4_;
  fStack_6dc = auVar89._4_4_;
  fStack_6d8 = auVar89._8_4_;
  fStack_6d4 = auVar89._12_4_;
  fVar116 = auVar235._0_4_;
  auVar73._0_4_ = fVar116 * local_6e0;
  fVar85 = auVar235._4_4_;
  auVar73._4_4_ = fVar85 * fStack_6dc;
  fVar87 = auVar235._8_4_;
  auVar73._8_4_ = fVar87 * fStack_6d8;
  fVar59 = auVar235._12_4_;
  auVar73._12_4_ = fVar59 * fStack_6d4;
  auVar168._0_4_ = fVar116 * auVar117._0_4_;
  auVar168._4_4_ = fVar85 * auVar117._4_4_;
  auVar168._8_4_ = fVar87 * auVar117._8_4_;
  auVar168._12_4_ = fVar59 * auVar117._12_4_;
  auVar181._0_4_ = fVar116 * auVar60._0_4_;
  auVar181._4_4_ = fVar85 * auVar60._4_4_;
  auVar181._8_4_ = fVar87 * auVar60._8_4_;
  auVar181._12_4_ = fVar59 * auVar60._12_4_;
  auVar196._0_4_ = fVar116 * auVar61._0_4_;
  auVar196._4_4_ = fVar85 * auVar61._4_4_;
  auVar196._8_4_ = fVar87 * auVar61._8_4_;
  auVar196._12_4_ = fVar59 * auVar61._12_4_;
  auVar117 = vfmadd231ps_fma(auVar73,auVar131,auVar136);
  auVar60 = vfmadd231ps_fma(auVar168,auVar131,auVar211);
  auVar235 = vfmadd231ps_fma(auVar181,auVar131,auVar226);
  auVar131 = vfmadd231ps_fma(auVar196,auVar131,ZEXT816(0));
  auVar89 = vmovshdup_avx(auVar66);
  auVar175 = vfmadd231ss_fma(ZEXT416((uint)(auVar89._0_4_ * auVar122._0_4_)),auVar66,
                             ZEXT416((uint)(1.0 - auVar122._0_4_)));
  auVar176 = vfmadd231ss_fma(ZEXT416((uint)(auVar89._0_4_ * auVar241._0_4_)),auVar66,
                             ZEXT416((uint)(1.0 - auVar241._0_4_)));
  fVar116 = 1.0 / fVar84;
  auVar122 = vsubps_avx(auVar60,auVar117);
  auVar212._0_4_ = auVar122._0_4_ * 3.0;
  auVar212._4_4_ = auVar122._4_4_ * 3.0;
  auVar212._8_4_ = auVar122._8_4_ * 3.0;
  auVar212._12_4_ = auVar122._12_4_ * 3.0;
  auVar122 = vsubps_avx(auVar235,auVar60);
  auVar227._0_4_ = auVar122._0_4_ * 3.0;
  auVar227._4_4_ = auVar122._4_4_ * 3.0;
  auVar227._8_4_ = auVar122._8_4_ * 3.0;
  auVar227._12_4_ = auVar122._12_4_ * 3.0;
  auVar122 = vsubps_avx(auVar131,auVar235);
  auVar236._0_4_ = auVar122._0_4_ * 3.0;
  auVar236._4_4_ = auVar122._4_4_ * 3.0;
  auVar236._8_4_ = auVar122._8_4_ * 3.0;
  auVar236._12_4_ = auVar122._12_4_ * 3.0;
  auVar89 = vminps_avx(auVar227,auVar236);
  auVar122 = vmaxps_avx(auVar227,auVar236);
  auVar89 = vminps_avx(auVar212,auVar89);
  auVar122 = vmaxps_avx(auVar212,auVar122);
  auVar61 = vshufpd_avx(auVar89,auVar89,3);
  auVar241 = vshufpd_avx(auVar122,auVar122,3);
  auVar89 = vminps_avx(auVar89,auVar61);
  auVar122 = vmaxps_avx(auVar122,auVar241);
  auVar228._0_4_ = auVar89._0_4_ * fVar116;
  auVar228._4_4_ = auVar89._4_4_ * fVar116;
  auVar228._8_4_ = auVar89._8_4_ * fVar116;
  auVar228._12_4_ = auVar89._12_4_ * fVar116;
  auVar213._0_4_ = auVar122._0_4_ * fVar116;
  auVar213._4_4_ = auVar122._4_4_ * fVar116;
  auVar213._8_4_ = auVar122._8_4_ * fVar116;
  auVar213._12_4_ = auVar122._12_4_ * fVar116;
  fVar116 = 1.0 / (auVar176._0_4_ - auVar175._0_4_);
  auVar122 = vshufpd_avx(auVar117,auVar117,3);
  auVar89 = vshufpd_avx(auVar60,auVar60,3);
  auVar61 = vshufpd_avx(auVar235,auVar235,3);
  auVar241 = vshufpd_avx(auVar131,auVar131,3);
  auVar122 = vsubps_avx(auVar122,auVar117);
  auVar117 = vsubps_avx(auVar89,auVar60);
  auVar60 = vsubps_avx(auVar61,auVar235);
  auVar241 = vsubps_avx(auVar241,auVar131);
  auVar89 = vminps_avx(auVar122,auVar117);
  auVar122 = vmaxps_avx(auVar122,auVar117);
  auVar61 = vminps_avx(auVar60,auVar241);
  auVar61 = vminps_avx(auVar89,auVar61);
  auVar89 = vmaxps_avx(auVar60,auVar241);
  auVar122 = vmaxps_avx(auVar122,auVar89);
  auVar254._0_4_ = fVar116 * auVar61._0_4_;
  auVar254._4_4_ = fVar116 * auVar61._4_4_;
  auVar254._8_4_ = fVar116 * auVar61._8_4_;
  auVar254._12_4_ = fVar116 * auVar61._12_4_;
  auVar242._0_4_ = fVar116 * auVar122._0_4_;
  auVar242._4_4_ = fVar116 * auVar122._4_4_;
  auVar242._8_4_ = fVar116 * auVar122._8_4_;
  auVar242._12_4_ = fVar116 * auVar122._12_4_;
  auVar241 = vinsertps_avx(auVar8,auVar175,0x10);
  auVar117 = vinsertps_avx(auVar9,auVar176,0x10);
  auVar237._0_4_ = (auVar241._0_4_ + auVar117._0_4_) * 0.5;
  auVar237._4_4_ = (auVar241._4_4_ + auVar117._4_4_) * 0.5;
  auVar237._8_4_ = (auVar241._8_4_ + auVar117._8_4_) * 0.5;
  auVar237._12_4_ = (auVar241._12_4_ + auVar117._12_4_) * 0.5;
  auVar74._4_4_ = auVar237._0_4_;
  auVar74._0_4_ = auVar237._0_4_;
  auVar74._8_4_ = auVar237._0_4_;
  auVar74._12_4_ = auVar237._0_4_;
  auVar122 = vfmadd213ps_fma(local_390,auVar74,auVar11);
  auVar89 = vfmadd213ps_fma(local_3a0,auVar74,auVar12);
  auVar61 = vfmadd213ps_fma(local_3b0,auVar74,auVar13);
  auVar9 = vsubps_avx(auVar89,auVar122);
  auVar122 = vfmadd213ps_fma(auVar9,auVar74,auVar122);
  auVar9 = vsubps_avx(auVar61,auVar89);
  auVar9 = vfmadd213ps_fma(auVar9,auVar74,auVar89);
  auVar9 = vsubps_avx(auVar9,auVar122);
  auVar122 = vfmadd231ps_fma(auVar122,auVar9,auVar74);
  auVar75._0_8_ = CONCAT44(auVar9._4_4_ * 3.0,auVar9._0_4_ * 3.0);
  auVar75._8_4_ = auVar9._8_4_ * 3.0;
  auVar75._12_4_ = auVar9._12_4_ * 3.0;
  auVar267._8_8_ = auVar122._0_8_;
  auVar267._0_8_ = auVar122._0_8_;
  auVar9 = vshufpd_avx(auVar122,auVar122,3);
  auVar122 = vshufps_avx(auVar237,auVar237,0x55);
  auVar235 = vsubps_avx(auVar9,auVar267);
  auVar141 = vfmadd231ps_fma(auVar267,auVar122,auVar235);
  auVar274._8_8_ = auVar75._0_8_;
  auVar274._0_8_ = auVar75._0_8_;
  auVar9 = vshufpd_avx(auVar75,auVar75,3);
  auVar9 = vsubps_avx(auVar9,auVar274);
  auVar131 = vfmadd213ps_fma(auVar9,auVar122,auVar274);
  auVar122 = vmovshdup_avx(auVar131);
  auVar275._0_8_ = auVar122._0_8_ ^ 0x8000000080000000;
  auVar275._8_4_ = auVar122._8_4_ ^ 0x80000000;
  auVar275._12_4_ = auVar122._12_4_ ^ 0x80000000;
  auVar89 = vmovshdup_avx(auVar235);
  auVar9 = vunpcklps_avx(auVar89,auVar275);
  auVar61 = vshufps_avx(auVar9,auVar275,4);
  auVar60 = vshufps_avx(auVar237,auVar237,0x54);
  auVar124._0_8_ = auVar235._0_8_ ^ 0x8000000080000000;
  auVar124._8_4_ = auVar235._8_4_ ^ 0x80000000;
  auVar124._12_4_ = auVar235._12_4_ ^ 0x80000000;
  auVar9 = vmovlhps_avx(auVar124,auVar131);
  auVar9 = vshufps_avx(auVar9,auVar131,8);
  auVar122 = vfmsub231ss_fma(ZEXT416((uint)(auVar235._0_4_ * auVar122._0_4_)),auVar89,auVar131);
  uVar57 = auVar122._0_4_;
  auVar76._4_4_ = uVar57;
  auVar76._0_4_ = uVar57;
  auVar76._8_4_ = uVar57;
  auVar76._12_4_ = uVar57;
  auVar122 = vdivps_avx(auVar61,auVar76);
  auVar89 = vdivps_avx(auVar9,auVar76);
  fVar87 = auVar141._0_4_;
  fVar116 = auVar122._0_4_;
  auVar9 = vshufps_avx(auVar141,auVar141,0x55);
  fVar85 = auVar89._0_4_;
  auVar77._0_4_ = fVar87 * fVar116 + auVar9._0_4_ * fVar85;
  auVar77._4_4_ = fVar87 * auVar122._4_4_ + auVar9._4_4_ * auVar89._4_4_;
  auVar77._8_4_ = fVar87 * auVar122._8_4_ + auVar9._8_4_ * auVar89._8_4_;
  auVar77._12_4_ = fVar87 * auVar122._12_4_ + auVar9._12_4_ * auVar89._12_4_;
  auVar156 = vsubps_avx(auVar60,auVar77);
  auVar60 = vmovshdup_avx(auVar122);
  auVar9 = vinsertps_avx(auVar228,auVar254,0x1c);
  auVar147._0_4_ = auVar60._0_4_ * auVar9._0_4_;
  auVar147._4_4_ = auVar60._4_4_ * auVar9._4_4_;
  auVar147._8_4_ = auVar60._8_4_ * auVar9._8_4_;
  auVar147._12_4_ = auVar60._12_4_ * auVar9._12_4_;
  auVar61 = vinsertps_avx(auVar213,auVar242,0x1c);
  auVar97._0_4_ = auVar61._0_4_ * auVar60._0_4_;
  auVar97._4_4_ = auVar61._4_4_ * auVar60._4_4_;
  auVar97._8_4_ = auVar61._8_4_ * auVar60._8_4_;
  auVar97._12_4_ = auVar61._12_4_ * auVar60._12_4_;
  auVar141 = vminps_avx(auVar147,auVar97);
  auVar131 = vmaxps_avx(auVar97,auVar147);
  auVar60 = vinsertps_avx(auVar254,auVar228,0x4c);
  auVar119 = vmovshdup_avx(auVar89);
  auVar235 = vinsertps_avx(auVar242,auVar213,0x4c);
  auVar243._0_4_ = auVar119._0_4_ * auVar60._0_4_;
  auVar243._4_4_ = auVar119._4_4_ * auVar60._4_4_;
  auVar243._8_4_ = auVar119._8_4_ * auVar60._8_4_;
  auVar243._12_4_ = auVar119._12_4_ * auVar60._12_4_;
  auVar229._0_4_ = auVar119._0_4_ * auVar235._0_4_;
  auVar229._4_4_ = auVar119._4_4_ * auVar235._4_4_;
  auVar229._8_4_ = auVar119._8_4_ * auVar235._8_4_;
  auVar229._12_4_ = auVar119._12_4_ * auVar235._12_4_;
  auVar119 = vminps_avx(auVar243,auVar229);
  auVar255._0_4_ = auVar141._0_4_ + auVar119._0_4_;
  auVar255._4_4_ = auVar141._4_4_ + auVar119._4_4_;
  auVar255._8_4_ = auVar141._8_4_ + auVar119._8_4_;
  auVar255._12_4_ = auVar141._12_4_ + auVar119._12_4_;
  auVar141 = vmaxps_avx(auVar229,auVar243);
  auVar98._0_4_ = auVar141._0_4_ + auVar131._0_4_;
  auVar98._4_4_ = auVar141._4_4_ + auVar131._4_4_;
  auVar98._8_4_ = auVar141._8_4_ + auVar131._8_4_;
  auVar98._12_4_ = auVar141._12_4_ + auVar131._12_4_;
  auVar230._8_8_ = 0x3f80000000000000;
  auVar230._0_8_ = 0x3f80000000000000;
  auVar131 = vsubps_avx(auVar230,auVar98);
  auVar141 = vsubps_avx(auVar230,auVar255);
  auVar119 = vsubps_avx(auVar241,auVar237);
  auVar142 = vsubps_avx(auVar117,auVar237);
  auVar112._0_4_ = fVar116 * auVar9._0_4_;
  auVar112._4_4_ = fVar116 * auVar9._4_4_;
  auVar112._8_4_ = fVar116 * auVar9._8_4_;
  auVar112._12_4_ = fVar116 * auVar9._12_4_;
  auVar256._0_4_ = fVar116 * auVar61._0_4_;
  auVar256._4_4_ = fVar116 * auVar61._4_4_;
  auVar256._8_4_ = fVar116 * auVar61._8_4_;
  auVar256._12_4_ = fVar116 * auVar61._12_4_;
  auVar61 = vminps_avx(auVar112,auVar256);
  auVar9 = vmaxps_avx(auVar256,auVar112);
  auVar148._0_4_ = fVar85 * auVar60._0_4_;
  auVar148._4_4_ = fVar85 * auVar60._4_4_;
  auVar148._8_4_ = fVar85 * auVar60._8_4_;
  auVar148._12_4_ = fVar85 * auVar60._12_4_;
  auVar214._0_4_ = fVar85 * auVar235._0_4_;
  auVar214._4_4_ = fVar85 * auVar235._4_4_;
  auVar214._8_4_ = fVar85 * auVar235._8_4_;
  auVar214._12_4_ = fVar85 * auVar235._12_4_;
  auVar60 = vminps_avx(auVar148,auVar214);
  auVar257._0_4_ = auVar61._0_4_ + auVar60._0_4_;
  auVar257._4_4_ = auVar61._4_4_ + auVar60._4_4_;
  auVar257._8_4_ = auVar61._8_4_ + auVar60._8_4_;
  auVar257._12_4_ = auVar61._12_4_ + auVar60._12_4_;
  fVar129 = auVar119._0_4_;
  auVar268._0_4_ = fVar129 * auVar131._0_4_;
  fVar261 = auVar119._4_4_;
  auVar268._4_4_ = fVar261 * auVar131._4_4_;
  fVar262 = auVar119._8_4_;
  auVar268._8_4_ = fVar262 * auVar131._8_4_;
  fVar186 = auVar119._12_4_;
  auVar268._12_4_ = fVar186 * auVar131._12_4_;
  auVar61 = vmaxps_avx(auVar214,auVar148);
  auVar215._0_4_ = fVar129 * auVar141._0_4_;
  auVar215._4_4_ = fVar261 * auVar141._4_4_;
  auVar215._8_4_ = fVar262 * auVar141._8_4_;
  auVar215._12_4_ = fVar186 * auVar141._12_4_;
  fVar87 = auVar142._0_4_;
  auVar99._0_4_ = fVar87 * auVar131._0_4_;
  fVar59 = auVar142._4_4_;
  auVar99._4_4_ = fVar59 * auVar131._4_4_;
  fVar155 = auVar142._8_4_;
  auVar99._8_4_ = fVar155 * auVar131._8_4_;
  fVar221 = auVar142._12_4_;
  auVar99._12_4_ = fVar221 * auVar131._12_4_;
  auVar231._0_4_ = fVar87 * auVar141._0_4_;
  auVar231._4_4_ = fVar59 * auVar141._4_4_;
  auVar231._8_4_ = fVar155 * auVar141._8_4_;
  auVar231._12_4_ = fVar221 * auVar141._12_4_;
  auVar113._0_4_ = auVar9._0_4_ + auVar61._0_4_;
  auVar113._4_4_ = auVar9._4_4_ + auVar61._4_4_;
  auVar113._8_4_ = auVar9._8_4_ + auVar61._8_4_;
  auVar113._12_4_ = auVar9._12_4_ + auVar61._12_4_;
  auVar149._8_8_ = 0x3f800000;
  auVar149._0_8_ = 0x3f800000;
  auVar9 = vsubps_avx(auVar149,auVar113);
  auVar61 = vsubps_avx(auVar149,auVar257);
  auVar258._0_4_ = fVar129 * auVar9._0_4_;
  auVar258._4_4_ = fVar261 * auVar9._4_4_;
  auVar258._8_4_ = fVar262 * auVar9._8_4_;
  auVar258._12_4_ = fVar186 * auVar9._12_4_;
  auVar244._0_4_ = fVar129 * auVar61._0_4_;
  auVar244._4_4_ = fVar261 * auVar61._4_4_;
  auVar244._8_4_ = fVar262 * auVar61._8_4_;
  auVar244._12_4_ = fVar186 * auVar61._12_4_;
  auVar114._0_4_ = fVar87 * auVar9._0_4_;
  auVar114._4_4_ = fVar59 * auVar9._4_4_;
  auVar114._8_4_ = fVar155 * auVar9._8_4_;
  auVar114._12_4_ = fVar221 * auVar9._12_4_;
  auVar150._0_4_ = fVar87 * auVar61._0_4_;
  auVar150._4_4_ = fVar59 * auVar61._4_4_;
  auVar150._8_4_ = fVar155 * auVar61._8_4_;
  auVar150._12_4_ = fVar221 * auVar61._12_4_;
  auVar9 = vminps_avx(auVar258,auVar244);
  auVar61 = vminps_avx(auVar114,auVar150);
  auVar9 = vminps_avx(auVar9,auVar61);
  auVar61 = vmaxps_avx(auVar244,auVar258);
  auVar60 = vmaxps_avx(auVar150,auVar114);
  auVar235 = vminps_avx(auVar268,auVar215);
  auVar131 = vminps_avx(auVar99,auVar231);
  auVar235 = vminps_avx(auVar235,auVar131);
  auVar9 = vhaddps_avx(auVar9,auVar235);
  auVar61 = vmaxps_avx(auVar60,auVar61);
  auVar60 = vmaxps_avx(auVar215,auVar268);
  auVar235 = vmaxps_avx(auVar231,auVar99);
  auVar60 = vmaxps_avx(auVar235,auVar60);
  auVar61 = vhaddps_avx(auVar61,auVar60);
  auVar9 = vshufps_avx(auVar9,auVar9,0xe8);
  auVar61 = vshufps_avx(auVar61,auVar61,0xe8);
  auVar232._0_4_ = auVar156._0_4_ + auVar9._0_4_;
  auVar232._4_4_ = auVar156._4_4_ + auVar9._4_4_;
  auVar232._8_4_ = auVar156._8_4_ + auVar9._8_4_;
  auVar232._12_4_ = auVar156._12_4_ + auVar9._12_4_;
  auVar216._0_4_ = auVar156._0_4_ + auVar61._0_4_;
  auVar216._4_4_ = auVar156._4_4_ + auVar61._4_4_;
  auVar216._8_4_ = auVar156._8_4_ + auVar61._8_4_;
  auVar216._12_4_ = auVar156._12_4_ + auVar61._12_4_;
  auVar219 = ZEXT1664(auVar216);
  auVar9 = vmaxps_avx(auVar241,auVar232);
  auVar61 = vminps_avx(auVar216,auVar117);
  auVar9 = vcmpps_avx(auVar61,auVar9,1);
  auVar9 = vshufps_avx(auVar9,auVar9,0x50);
  if ((auVar9 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar9[0xf] < '\0')
  goto LAB_0115f5f3;
  bVar53 = 0;
  if ((auVar185._0_4_ < auVar232._0_4_) && (bVar53 = 0, auVar216._0_4_ < auVar117._0_4_)) {
    auVar61 = vmovshdup_avx(auVar232);
    auVar9 = vcmpps_avx(auVar216,auVar117,1);
    bVar53 = auVar9[4] & auVar175._0_4_ < auVar61._0_4_;
  }
  if (((3 < (uint)uVar50 || fVar84 < 0.001) | bVar53) == 1) {
    lVar52 = 0xc9;
    auVar219 = ZEXT464(0x40400000);
    do {
      lVar52 = lVar52 + -1;
      if (lVar52 == 0) goto LAB_0115f5f3;
      fVar59 = auVar156._0_4_;
      fVar87 = 1.0 - fVar59;
      fVar84 = fVar87 * fVar87 * fVar87;
      fVar86 = fVar59 * 3.0 * fVar87 * fVar87;
      fVar87 = fVar87 * fVar59 * fVar59 * 3.0;
      auVar137._4_4_ = fVar84;
      auVar137._0_4_ = fVar84;
      auVar137._8_4_ = fVar84;
      auVar137._12_4_ = fVar84;
      auVar115._4_4_ = fVar86;
      auVar115._0_4_ = fVar86;
      auVar115._8_4_ = fVar86;
      auVar115._12_4_ = fVar86;
      auVar100._4_4_ = fVar87;
      auVar100._0_4_ = fVar87;
      auVar100._8_4_ = fVar87;
      auVar100._12_4_ = fVar87;
      fVar59 = fVar59 * fVar59 * fVar59;
      auVar151._0_4_ = (float)local_3c0._0_4_ * fVar59;
      auVar151._4_4_ = (float)local_3c0._4_4_ * fVar59;
      auVar151._8_4_ = fStack_3b8 * fVar59;
      auVar151._12_4_ = fStack_3b4 * fVar59;
      auVar8 = vfmadd231ps_fma(auVar151,auVar13,auVar100);
      auVar8 = vfmadd231ps_fma(auVar8,auVar12,auVar115);
      auVar8 = vfmadd231ps_fma(auVar8,auVar11,auVar137);
      auVar101._8_8_ = auVar8._0_8_;
      auVar101._0_8_ = auVar8._0_8_;
      auVar8 = vshufpd_avx(auVar8,auVar8,3);
      auVar9 = vshufps_avx(auVar156,auVar156,0x55);
      auVar8 = vsubps_avx(auVar8,auVar101);
      auVar9 = vfmadd213ps_fma(auVar8,auVar9,auVar101);
      fVar84 = auVar9._0_4_;
      auVar8 = vshufps_avx(auVar9,auVar9,0x55);
      auVar102._0_4_ = fVar116 * fVar84 + fVar85 * auVar8._0_4_;
      auVar102._4_4_ = auVar122._4_4_ * fVar84 + auVar89._4_4_ * auVar8._4_4_;
      auVar102._8_4_ = auVar122._8_4_ * fVar84 + auVar89._8_4_ * auVar8._8_4_;
      auVar102._12_4_ = auVar122._12_4_ * fVar84 + auVar89._12_4_ * auVar8._12_4_;
      auVar156 = vsubps_avx(auVar156,auVar102);
      auVar8 = vandps_avx(local_500,auVar9);
      auVar9 = vshufps_avx(auVar8,auVar8,0xf5);
      auVar8 = vmaxss_avx(auVar9,auVar8);
    } while ((float)local_3d0._0_4_ <= auVar8._0_4_);
    local_120 = auVar156._0_4_;
    if ((0.0 <= local_120) && (local_120 <= 1.0)) {
      auVar8 = vmovshdup_avx(auVar156);
      fVar84 = auVar8._0_4_;
      if ((0.0 <= fVar84) && (fVar84 <= 1.0)) {
        auVar9 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                               ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
        auVar235 = vinsertps_avx(auVar9,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
        auVar9 = vdpps_avx(auVar235,local_520,0x7f);
        auVar122 = vdpps_avx(auVar235,local_530,0x7f);
        auVar89 = vdpps_avx(auVar235,local_3e0,0x7f);
        auVar61 = vdpps_avx(auVar235,local_3f0,0x7f);
        auVar241 = vdpps_avx(auVar235,local_400,0x7f);
        auVar117 = vdpps_avx(auVar235,local_410,0x7f);
        auVar60 = vdpps_avx(auVar235,local_420,0x7f);
        auVar235 = vdpps_avx(auVar235,local_430,0x7f);
        fVar86 = 1.0 - fVar84;
        auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar84 * auVar241._0_4_)),ZEXT416((uint)fVar86),
                                 auVar9);
        auVar122 = vfmadd231ss_fma(ZEXT416((uint)(auVar117._0_4_ * fVar84)),ZEXT416((uint)fVar86),
                                   auVar122);
        auVar219 = ZEXT1664(auVar122);
        auVar89 = vfmadd231ss_fma(ZEXT416((uint)(auVar60._0_4_ * fVar84)),ZEXT416((uint)fVar86),
                                  auVar89);
        auVar61 = vfmadd231ss_fma(ZEXT416((uint)(fVar84 * auVar235._0_4_)),ZEXT416((uint)fVar86),
                                  auVar61);
        fVar87 = 1.0 - local_120;
        fVar86 = fVar87 * local_120 * local_120 * 3.0;
        fVar155 = local_120 * local_120 * local_120;
        auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar155 * auVar61._0_4_)),ZEXT416((uint)fVar86),
                                  auVar89);
        fVar116 = local_120 * 3.0 * fVar87 * fVar87;
        auVar122 = vfmadd231ss_fma(auVar89,ZEXT416((uint)fVar116),auVar122);
        fVar85 = fVar87 * fVar87 * fVar87;
        auVar9 = vfmadd231ss_fma(auVar122,ZEXT416((uint)fVar85),auVar9);
        fVar59 = auVar9._0_4_;
        if (((fVar58 <= fVar59) && (fVar221 = *(float *)(ray + k * 4 + 0x100), fVar59 <= fVar221))
           && (pGVar4 = (context->scene->geometries).items[uVar48].ptr,
              (pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) != 0)) {
          auVar9 = vshufps_avx(auVar156,auVar156,0x55);
          auVar217._8_4_ = 0x3f800000;
          auVar217._0_8_ = 0x3f8000003f800000;
          auVar217._12_4_ = 0x3f800000;
          auVar122 = vsubps_avx(auVar217,auVar9);
          fVar129 = auVar9._0_4_;
          auVar233._0_4_ = fVar129 * (float)local_550._0_4_;
          fVar261 = auVar9._4_4_;
          auVar233._4_4_ = fVar261 * (float)local_550._4_4_;
          fVar262 = auVar9._8_4_;
          auVar233._8_4_ = fVar262 * fStack_548;
          fVar186 = auVar9._12_4_;
          auVar233._12_4_ = fVar186 * fStack_544;
          auVar238._0_4_ = fVar129 * (float)local_590._0_4_;
          auVar238._4_4_ = fVar261 * (float)local_590._4_4_;
          auVar238._8_4_ = fVar262 * fStack_588;
          auVar238._12_4_ = fVar186 * fStack_584;
          auVar245._0_4_ = fVar129 * (float)local_5a0._0_4_;
          auVar245._4_4_ = fVar261 * (float)local_5a0._4_4_;
          auVar245._8_4_ = fVar262 * fStack_598;
          auVar245._12_4_ = fVar186 * fStack_594;
          auVar197._0_4_ = fVar129 * fVar154;
          auVar197._4_4_ = fVar261 * fVar172;
          auVar197._8_4_ = fVar262 * fVar173;
          auVar197._12_4_ = fVar186 * fVar174;
          auVar9 = vfmadd231ps_fma(auVar233,auVar122,local_540);
          auVar89 = vfmadd231ps_fma(auVar238,auVar122,local_570);
          auVar61 = vfmadd231ps_fma(auVar245,auVar122,local_580);
          auVar241 = vfmadd231ps_fma(auVar197,auVar122,local_560);
          auVar122 = vsubps_avx(auVar89,auVar9);
          auVar219 = ZEXT1664(auVar122);
          auVar9 = vsubps_avx(auVar61,auVar89);
          auVar89 = vsubps_avx(auVar241,auVar61);
          auVar246._0_4_ = local_120 * auVar9._0_4_;
          auVar246._4_4_ = local_120 * auVar9._4_4_;
          auVar246._8_4_ = local_120 * auVar9._8_4_;
          auVar246._12_4_ = local_120 * auVar9._12_4_;
          auVar182._4_4_ = fVar87;
          auVar182._0_4_ = fVar87;
          auVar182._8_4_ = fVar87;
          auVar182._12_4_ = fVar87;
          auVar61 = vfmadd231ps_fma(auVar246,auVar182,auVar122);
          auVar198._0_4_ = local_120 * auVar89._0_4_;
          auVar198._4_4_ = local_120 * auVar89._4_4_;
          auVar198._8_4_ = local_120 * auVar89._8_4_;
          auVar198._12_4_ = local_120 * auVar89._12_4_;
          auVar9 = vfmadd231ps_fma(auVar198,auVar182,auVar9);
          auVar199._0_4_ = local_120 * auVar9._0_4_;
          auVar199._4_4_ = local_120 * auVar9._4_4_;
          auVar199._8_4_ = local_120 * auVar9._8_4_;
          auVar199._12_4_ = local_120 * auVar9._12_4_;
          auVar89 = vfmadd231ps_fma(auVar199,auVar182,auVar61);
          auVar169._0_4_ = fVar155 * (float)local_480._0_4_;
          auVar169._4_4_ = fVar155 * (float)local_480._4_4_;
          auVar169._8_4_ = fVar155 * fStack_478;
          auVar169._12_4_ = fVar155 * fStack_474;
          auVar125._4_4_ = fVar86;
          auVar125._0_4_ = fVar86;
          auVar125._8_4_ = fVar86;
          auVar125._12_4_ = fVar86;
          auVar9 = vfmadd132ps_fma(auVar125,auVar169,local_470);
          auVar152._4_4_ = fVar116;
          auVar152._0_4_ = fVar116;
          auVar152._8_4_ = fVar116;
          auVar152._12_4_ = fVar116;
          auVar9 = vfmadd132ps_fma(auVar152,auVar9,local_460);
          auVar170._0_4_ = auVar89._0_4_ * 3.0;
          auVar170._4_4_ = auVar89._4_4_ * 3.0;
          auVar170._8_4_ = auVar89._8_4_ * 3.0;
          auVar170._12_4_ = auVar89._12_4_ * 3.0;
          auVar138._4_4_ = fVar85;
          auVar138._0_4_ = fVar85;
          auVar138._8_4_ = fVar85;
          auVar138._12_4_ = fVar85;
          auVar89 = vfmadd132ps_fma(auVar138,auVar9,local_450);
          auVar9 = vshufps_avx(auVar170,auVar170,0xc9);
          auVar126._0_4_ = auVar89._0_4_ * auVar9._0_4_;
          auVar126._4_4_ = auVar89._4_4_ * auVar9._4_4_;
          auVar126._8_4_ = auVar89._8_4_ * auVar9._8_4_;
          auVar126._12_4_ = auVar89._12_4_ * auVar9._12_4_;
          auVar9 = vshufps_avx(auVar89,auVar89,0xc9);
          auVar9 = vfmsub231ps_fma(auVar126,auVar170,auVar9);
          local_140 = auVar9._0_4_;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            *(float *)(ray + k * 4 + 0x100) = fVar59;
            uVar57 = vextractps_avx(auVar9,1);
            *(undefined4 *)(ray + k * 4 + 0x180) = uVar57;
            uVar57 = vextractps_avx(auVar9,2);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar57;
            *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
            *(float *)(ray + k * 4 + 0x1e0) = local_120;
            *(float *)(ray + k * 4 + 0x200) = fVar84;
            *(uint *)(ray + k * 4 + 0x220) = uVar3;
            *(uint *)(ray + k * 4 + 0x240) = uVar48;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            goto LAB_0115f5f3;
          }
          local_100 = auVar8._0_8_;
          auVar8 = vmovshdup_avx(auVar9);
          local_180 = auVar8._0_8_;
          auVar8 = vshufps_avx(auVar9,auVar9,0xaa);
          local_160 = auVar8._0_8_;
          uStack_178 = local_180;
          uStack_170 = local_180;
          uStack_168 = local_180;
          uStack_158 = local_160;
          uStack_150 = local_160;
          uStack_148 = local_160;
          uStack_13c = local_140;
          uStack_138 = local_140;
          uStack_134 = local_140;
          uStack_130 = local_140;
          uStack_12c = local_140;
          uStack_128 = local_140;
          uStack_124 = local_140;
          fStack_11c = local_120;
          fStack_118 = local_120;
          fStack_114 = local_120;
          fStack_110 = local_120;
          fStack_10c = local_120;
          fStack_108 = local_120;
          fStack_104 = local_120;
          uStack_f8 = local_100;
          uStack_f0 = local_100;
          uStack_e8 = local_100;
          local_e0 = CONCAT44(uStack_33c,local_340);
          uStack_d8 = CONCAT44(uStack_334,uStack_338);
          uStack_d0 = CONCAT44(uStack_32c,uStack_330);
          uStack_c8 = CONCAT44(uStack_324,uStack_328);
          local_c0._4_4_ = uStack_31c;
          local_c0._0_4_ = local_320;
          local_c0._8_4_ = uStack_318;
          local_c0._12_4_ = uStack_314;
          local_c0._16_4_ = uStack_310;
          local_c0._20_4_ = uStack_30c;
          local_c0._24_4_ = uStack_308;
          local_c0._28_4_ = uStack_304;
          vpcmpeqd_avx2(local_c0,local_c0);
          uStack_9c = context->user->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = context->user->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          *(float *)(ray + k * 4 + 0x100) = fVar59;
          local_4c0 = local_360;
          local_5f0.valid = (int *)local_4c0;
          local_5f0.geometryUserPtr = pGVar4->userPtr;
          local_5f0.context = context->user;
          local_5f0.hit = (RTCHitN *)&local_180;
          local_5f0.N = 8;
          local_5f0.ray = (RTCRayN *)ray;
          if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            auVar219 = ZEXT1664(auVar122);
            (*pGVar4->intersectionFilterN)(&local_5f0);
          }
          auVar79 = vpcmpeqd_avx2(local_4c0,_DAT_01f7b000);
          auVar79 = _DAT_01f7b020 & ~auVar79;
          if ((((((((auVar79 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar79 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar79 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar79 >> 0x7f,0) != '\0') ||
                (auVar79 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar79 >> 0xbf,0) != '\0') ||
              (auVar79 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar79[0x1f] < '\0') {
            p_Var7 = context->args->filter;
            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
              auVar219 = ZEXT1664(auVar219._0_16_);
              (*p_Var7)(&local_5f0);
            }
            auVar15 = vpcmpeqd_avx2(local_4c0,_DAT_01f7b000);
            auVar79 = _DAT_01f7b020 & ~auVar15;
            if ((((((((auVar79 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar79 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar79 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar79 >> 0x7f,0) != '\0') ||
                  (auVar79 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar79 >> 0xbf,0) != '\0') ||
                (auVar79 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar79[0x1f] < '\0') {
              auVar83._0_8_ = auVar15._0_8_ ^ 0xffffffffffffffff;
              auVar83._8_4_ = auVar15._8_4_ ^ 0xffffffff;
              auVar83._12_4_ = auVar15._12_4_ ^ 0xffffffff;
              auVar83._16_4_ = auVar15._16_4_ ^ 0xffffffff;
              auVar83._20_4_ = auVar15._20_4_ ^ 0xffffffff;
              auVar83._24_4_ = auVar15._24_4_ ^ 0xffffffff;
              auVar83._28_4_ = auVar15._28_4_ ^ 0xffffffff;
              auVar79 = vmaskmovps_avx(auVar83,*(undefined1 (*) [32])local_5f0.hit);
              *(undefined1 (*) [32])(local_5f0.ray + 0x180) = auVar79;
              auVar79 = vmaskmovps_avx(auVar83,*(undefined1 (*) [32])(local_5f0.hit + 0x20));
              *(undefined1 (*) [32])(local_5f0.ray + 0x1a0) = auVar79;
              auVar79 = vmaskmovps_avx(auVar83,*(undefined1 (*) [32])(local_5f0.hit + 0x40));
              *(undefined1 (*) [32])(local_5f0.ray + 0x1c0) = auVar79;
              auVar79 = vmaskmovps_avx(auVar83,*(undefined1 (*) [32])(local_5f0.hit + 0x60));
              *(undefined1 (*) [32])(local_5f0.ray + 0x1e0) = auVar79;
              auVar79 = vmaskmovps_avx(auVar83,*(undefined1 (*) [32])(local_5f0.hit + 0x80));
              *(undefined1 (*) [32])(local_5f0.ray + 0x200) = auVar79;
              auVar79 = vpmaskmovd_avx2(auVar83,*(undefined1 (*) [32])(local_5f0.hit + 0xa0));
              *(undefined1 (*) [32])(local_5f0.ray + 0x220) = auVar79;
              auVar79 = vpmaskmovd_avx2(auVar83,*(undefined1 (*) [32])(local_5f0.hit + 0xc0));
              *(undefined1 (*) [32])(local_5f0.ray + 0x240) = auVar79;
              auVar79 = vpmaskmovd_avx2(auVar83,*(undefined1 (*) [32])(local_5f0.hit + 0xe0));
              *(undefined1 (*) [32])(local_5f0.ray + 0x260) = auVar79;
              auVar79 = vpmaskmovd_avx2(auVar83,*(undefined1 (*) [32])(local_5f0.hit + 0x100));
              *(undefined1 (*) [32])(local_5f0.ray + 0x280) = auVar79;
              goto LAB_0115f5f3;
            }
          }
          *(float *)(ray + k * 4 + 0x100) = fVar221;
        }
      }
    }
    goto LAB_0115f5f3;
  }
  local_440 = vinsertps_avx(auVar8,ZEXT416((uint)fVar86),0x10);
  auVar66 = vinsertps_avx(auVar175,ZEXT416((uint)auVar176._0_4_),0x10);
  goto LAB_0115f050;
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }